

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

char * duckdb_yyjson::yyjson_val_write_opts
                 (yyjson_val *val,yyjson_write_flag flg,yyjson_alc *alc_ptr,usize *dat_len,
                 yyjson_write_err *err)

{
  undefined4 *puVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  _func_void_ptr_void_ptr_size_t *p_Var5;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  yyjson_write_err *pyVar58;
  ulong *puVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar63;
  uint *puVar64;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  char *pcVar65;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  uint uVar66;
  int iVar67;
  char *pcVar68;
  long lVar69;
  yyjson_write_err *pyVar70;
  undefined2 uVar71;
  int iVar72;
  undefined8 uVar73;
  size_t sVar74;
  undefined1 *puVar75;
  byte *pbVar76;
  uint *puVar77;
  uint *puVar78;
  ulong *puVar79;
  ulong uVar80;
  size_t sVar81;
  byte *pbVar82;
  ulong uVar83;
  ulong uVar84;
  int iVar85;
  uint uVar86;
  int iVar87;
  uint *puVar88;
  undefined2 *puVar89;
  long lVar90;
  int iVar91;
  uint uVar92;
  yyjson_val *pyVar93;
  ulong uVar94;
  undefined **ppuVar95;
  uint uVar96;
  long lVar97;
  ulong uVar98;
  undefined1 *puVar99;
  uint uVar100;
  ulong uVar101;
  uint *puVar102;
  undefined8 *puVar103;
  size_t sVar104;
  byte bVar105;
  uint *puVar106;
  long lVar107;
  bool bVar108;
  bool bVar109;
  yyjson_write_err dummy_err;
  char local_ec;
  byte *local_e8;
  ulong local_e0;
  ulong local_d8;
  uint *local_b8;
  ulong *local_90;
  uint *local_78;
  uint *local_60;
  yyjson_write_err local_50;
  ulong local_40;
  undefined4 *local_38;
  
  ppuVar95 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar95 = &alc_ptr->malloc;
  }
  pyVar58 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar58 = &local_50;
  }
  if (val != (yyjson_val *)0x0) {
    p_Var5 = ((yyjson_alc *)ppuVar95)->malloc;
    p_Var6 = ((yyjson_alc *)ppuVar95)->free;
    pvVar7 = ((yyjson_alc *)ppuVar95)->ctx;
    uVar84 = val->tag;
    bVar105 = (byte)uVar84;
    local_ec = (char)flg;
    if (0xff < uVar84 && (~bVar105 & 6) == 0) {
      p_Var8 = ((yyjson_alc *)ppuVar95)->realloc;
      if ((flg & 0x41) == 0) {
        if ((flg & 2) == 0) {
          puVar75 = enc_table_cpy;
          puVar99 = enc_table_cpy_slash;
        }
        else {
          puVar75 = enc_table_esc;
          puVar99 = enc_table_esc_slash;
        }
        if ((flg & 4) == 0) {
          puVar99 = puVar75;
        }
        sVar104 = ((val->uni).u64 >> 4) * 0x12 + 0x47 & 0xfffffffffffffff8;
        local_e8 = (byte *)(*p_Var5)(pvVar7,sVar104);
        if (local_e8 != (byte *)0x0) {
          bVar109 = (~(uint)val->tag & 7) == 0;
          local_d8 = (ulong)bVar109;
          lVar107 = (val->tag >> 8) << bVar109;
          *local_e8 = bVar109 << 5 | 0x5b;
          puVar106 = (uint *)(local_e8 + 1);
          pyVar93 = val + 1;
          puVar77 = (uint *)(local_e8 + sVar104);
          local_b8 = puVar77;
LAB_01d4d540:
          uVar84 = local_d8 & 0xff;
LAB_01d4d551:
          uVar63 = pyVar93->tag;
          bVar105 = (byte)uVar63 & 7;
          if (bVar105 == 4) {
            if (puVar77 <= puVar106 + 8) {
              uVar63 = sVar104 >> 1;
              if (uVar63 < 0x21) {
                uVar63 = 0x20;
              }
              sVar81 = (uVar63 + 7 & 0xfffffffffffffff8) + sVar104;
              pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,sVar81);
              if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
              sVar74 = (long)local_b8 - (long)puVar77;
              memmove(pbVar82 + (sVar81 - sVar74),pbVar82 + ((long)puVar77 - (long)local_e8),sVar74)
              ;
              puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
              local_b8 = (uint *)(pbVar82 + sVar81);
              puVar77 = (uint *)(pbVar82 + (sVar81 - sVar74));
              sVar104 = sVar81;
              local_e8 = pbVar82;
            }
            pcVar65 = (char *)(pyVar93->uni).u64;
            uVar66 = (uint)((ulong)pcVar65 >> 0x20);
            if ((pyVar93->tag & 0x10) == 0) {
              uVar66 = uVar66 >> 0x1f & (uint)(pyVar93->tag >> 3);
              *(byte *)puVar106 = 0x2d;
              pcVar68 = (char *)-(long)pcVar65;
              if (uVar66 == 0) {
                pcVar68 = pcVar65;
              }
              pbVar82 = (byte *)((ulong)uVar66 + (long)puVar106);
              if (pcVar68 < (char *)0x5f5e100) {
                if (pcVar68 < (char *)0x64) {
                  *(undefined2 *)pbVar82 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar68 < (char *)0xa) + (long)pcVar68 * 2);
                  puVar106 = (uint *)(pbVar82 + (2 - (ulong)(pcVar68 < (char *)0xa)));
                }
                else {
                  iVar72 = (int)pcVar68;
                  if (pcVar68 < (char *)0x2710) {
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(pcVar68 < (char *)0x3e8);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                    puVar106 = (uint *)(pbVar82 + (4 - uVar63));
                  }
                  else if (pcVar68 < (char *)0xf4240) {
                    iVar72 = (int)((ulong)((long)pcVar68 * 0x68db9) >> 0x20) * -10000 + iVar72;
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(pcVar68 < (char *)0x186a0);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)
                          (digit_table + uVar63 + ((ulong)((long)pcVar68 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                    puVar106 = (uint *)(pbVar82 + (6 - uVar63));
                  }
                  else {
                    uVar66 = (uint)((ulong)((long)pcVar68 * 0x68db8bb) >> 0x20);
                    uVar100 = uVar66 >> 8;
                    iVar72 = uVar100 * -10000 + iVar72;
                    uVar100 = uVar100 * 0x147b >> 0x13;
                    uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(pcVar68 < "stampNSERKS1_EEEE");
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar100 * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                    *(undefined2 *)(pbVar82 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                    *(undefined2 *)(pbVar82 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                    puVar106 = (uint *)(pbVar82 + (8 - uVar63));
                  }
                }
              }
              else {
                uVar63 = (ulong)pcVar68 / 100000000;
                pcVar65 = pcVar68 + uVar63 * 0xfa0a1f00;
                iVar72 = (int)uVar63;
                if (pcVar68 < (char *)0x2386f26fc10000) {
                  if (pcVar68 < (char *)0x2540be400) {
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar68 < (char *)0x3b9aca00) + uVar63 * 2);
                    pbVar82 = pbVar82 + (2 - (ulong)(pcVar68 < (char *)0x3b9aca00));
                  }
                  else if (pcVar68 < (char *)0xe8d4a51000) {
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(pcVar68 < (char *)0x174876e800);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                    pbVar82 = pbVar82 + (4 - uVar63);
                  }
                  else if (pcVar68 < (char *)0x5af3107a4000) {
                    iVar72 = (int)(uVar63 * 0x68db9 >> 0x20) * -10000 + iVar72;
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar80 = (ulong)(pcVar68 < (char *)0x9184e72a000);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar80 + (uVar63 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar80)) =
                         *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + (4 - uVar80)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                    pbVar82 = pbVar82 + (6 - uVar80);
                  }
                  else {
                    uVar66 = (uint)(uVar63 * 0x68db8bb >> 0x20);
                    uVar100 = uVar66 >> 8;
                    iVar72 = uVar100 * -10000 + iVar72;
                    uVar100 = uVar100 * 0x147b >> 0x13;
                    uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(pcVar68 < (char *)0x38d7ea4c68000);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar100 * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                    *(undefined2 *)(pbVar82 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                    *(undefined2 *)(pbVar82 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                    pbVar82 = pbVar82 + (8 - uVar63);
                  }
                  uVar66 = (uint)(((ulong)pcVar65 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar100 = uVar66 >> 8;
                  iVar72 = uVar100 * -10000 + (int)pcVar65;
                  uVar100 = uVar100 * 0x147b >> 0x13;
                  uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                  *(undefined2 *)(pbVar82 + 2) =
                       *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                  *(undefined2 *)(pbVar82 + 4) = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                  *(undefined2 *)(pbVar82 + 6) =
                       *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
                  puVar106 = (uint *)(pbVar82 + 8);
                }
                else {
                  uVar63 = (ulong)pcVar68 / 1000000000000;
                  iVar67 = (int)uVar63;
                  if (pcVar68 < (char *)0xde0b6b3a7640000) {
                    iVar91 = (int)(uVar63 * 0x68db9 >> 0x20) * -10000 + iVar67;
                    uVar66 = (uint)(iVar91 * 0x147b) >> 0x13;
                    uVar80 = (ulong)(pcVar68 < (char *)0x16345785d8a0000);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar80 + (uVar63 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar80)) =
                         *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + (4 - uVar80)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar91) * 2);
                    lVar97 = 6 - uVar80;
                  }
                  else {
                    uVar66 = (uint)(uVar63 / 10000);
                    iVar91 = uVar66 * -10000 + iVar67;
                    uVar66 = uVar66 / 100;
                    uVar100 = (uint)(iVar91 * 0x147b) >> 0x13;
                    uVar80 = (ulong)(pcVar68 < (char *)0x8ac7230489e80000);
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)(digit_table + uVar80 + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + (2 - uVar80)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + (int)(uVar63 / 10000)) * 2);
                    *(undefined2 *)(pbVar82 + (4 - uVar80)) =
                         *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                    *(undefined2 *)(pbVar82 + (6 - uVar80)) =
                         *(undefined2 *)(digit_table + (uVar100 * -100 + iVar91) * 2);
                    lVar97 = 8 - uVar80;
                  }
                  pbVar82 = pbVar82 + lVar97;
                  iVar72 = iVar72 + iVar67 * -10000;
                  uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                  *(undefined2 *)(pbVar82 + 2) =
                       *(undefined2 *)(digit_table + (uVar66 * 0x7fffff9c + iVar72) * 2);
                  uVar66 = (uint)(((ulong)pcVar65 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar100 = uVar66 >> 8;
                  iVar72 = uVar100 * -10000 + (int)pcVar65;
                  uVar100 = uVar100 * 0x147b >> 0x13;
                  uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar82 + 4) = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                  *(undefined2 *)(pbVar82 + 6) =
                       *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                  *(undefined2 *)(pbVar82 + 8) = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                  *(undefined2 *)(pbVar82 + 10) =
                       *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
                  puVar106 = (uint *)(pbVar82 + 0xc);
                }
              }
            }
            else {
              uVar63 = (ulong)pcVar65 & 0xfffffffffffff;
              uVar66 = uVar66 >> 0x14 & 0x7ff;
              if (uVar66 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) {
                    puVar106 = (uint *)0x0;
                  }
                  else if (uVar63 == 0) {
                    *(byte *)puVar106 = 0x2d;
                    puVar103 = (undefined8 *)((long)puVar106 - ((long)pcVar65 >> 0x3f));
                    *puVar103 = 0x7974696e69666e49;
                    puVar106 = (uint *)(puVar103 + 1);
                  }
                  else {
                    *puVar106 = 0x4e614e;
                    puVar106 = (uint *)((long)puVar106 + 3);
                  }
                }
                else {
                  *puVar106 = 0x6c6c756e;
                  puVar106 = puVar106 + 1;
                }
              }
              else {
                *(byte *)puVar106 = 0x2d;
                lVar97 = -((long)pcVar65 >> 0x3f);
                puVar1 = (undefined4 *)((long)puVar106 + lVar97);
                if (((ulong)pcVar65 & 0x7fffffffffffffff) == 0) {
                  *puVar1 = 0x302e30;
                  puVar106 = (uint *)((long)puVar1 + 3);
                }
                else if (uVar66 == 0) {
                  yyjson_val_write_opts();
                  puVar106 = local_78;
                }
                else {
                  uVar80 = uVar63 + 0x10000000000000;
                  if (uVar66 - 0x3ff < 0x35) {
                    lVar90 = 0;
                    if (uVar80 != 0) {
                      for (; (uVar80 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
                      }
                    }
                    if ((uint)lVar90 < 0x433 - uVar66) goto LAB_01d4d7d1;
                    pcVar65 = (char *)(uVar80 >> ((byte)(0x433 - uVar66) & 0x3f));
                    if (pcVar65 < (char *)0x5f5e100) {
                      if (pcVar65 < (char *)0x64) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar65 < (char *)0xa) + (long)pcVar65 * 2);
                        pcVar65 = (char *)((long)puVar1 + (2 - (ulong)(pcVar65 < (char *)0xa)));
                      }
                      else {
                        iVar72 = (int)pcVar65;
                        if (pcVar65 < (char *)0x2710) {
                          uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar63 = (ulong)(pcVar65 < (char *)0x3e8);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar63 + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                          pcVar65 = (char *)((long)puVar1 + (4 - uVar63));
                        }
                        else if (pcVar65 < (char *)0xf4240) {
                          iVar72 = (int)((ulong)((long)pcVar65 * 0x68db9) >> 0x20) * -10000 + iVar72
                          ;
                          uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar63 = (ulong)(pcVar65 < (char *)0x186a0);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table +
                                uVar63 + ((ulong)((long)pcVar65 * 0x68db9) >> 0x20) * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar63)) =
                               *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                          pcVar65 = (char *)((long)puVar1 + (6 - uVar63));
                        }
                        else {
                          uVar66 = (uint)((ulong)((long)pcVar65 * 0x68db8bb) >> 0x20);
                          uVar100 = uVar66 >> 8;
                          iVar72 = uVar100 * -10000 + iVar72;
                          uVar100 = uVar100 * 0x147b >> 0x13;
                          uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar63 = (ulong)(pcVar65 < "stampNSERKS1_EEEE");
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar63 + (ulong)uVar100 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar63)) =
                               *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                          *(undefined2 *)((long)puVar1 + (6 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                          pcVar65 = (char *)((long)puVar1 + (8 - uVar63));
                        }
                      }
                    }
                    else {
                      auVar23._8_8_ = 0;
                      auVar23._0_8_ = pcVar65;
                      uVar63 = SUB168(auVar23 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                      if (pcVar65 < (char *)0x2540be400) {
                        *(undefined2 *)puVar1 =
                             *(undefined2 *)
                              (digit_table + (ulong)(pcVar65 < (char *)0x3b9aca00) + uVar63 * 2);
                        puVar89 = (undefined2 *)
                                  ((long)puVar1 + (2 - (ulong)(pcVar65 < (char *)0x3b9aca00)));
                      }
                      else {
                        iVar72 = (int)uVar63;
                        if (pcVar65 < (char *)0xe8d4a51000) {
                          uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar80 = (ulong)(pcVar65 < (char *)0x174876e800);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar80 + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar80)) =
                               *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                          puVar89 = (undefined2 *)((long)puVar1 + (4 - uVar80));
                        }
                        else if (pcVar65 < (char *)0x5af3107a4000) {
                          iVar72 = (int)(uVar63 * 0x68db9 >> 0x20) * -10000 + iVar72;
                          uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar80 = (ulong)(pcVar65 < (char *)0x9184e72a000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)
                                (digit_table + uVar80 + (uVar63 * 0x68db9 >> 0x20) * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar80)) =
                               *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar80)) =
                               *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                          puVar89 = (undefined2 *)((long)puVar1 + (6 - uVar80));
                        }
                        else {
                          uVar66 = (uint)(uVar63 * 0x68db8bb >> 0x20);
                          uVar100 = uVar66 >> 8;
                          iVar72 = uVar100 * -10000 + iVar72;
                          uVar100 = uVar100 * 0x147b >> 0x13;
                          uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                          uVar80 = (ulong)(pcVar65 < (char *)0x38d7ea4c68000);
                          *(undefined2 *)puVar1 =
                               *(undefined2 *)(digit_table + uVar80 + (ulong)uVar100 * 2);
                          *(undefined2 *)((long)puVar1 + (2 - uVar80)) =
                               *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                          *(undefined2 *)((long)puVar1 + (4 - uVar80)) =
                               *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                          *(undefined2 *)((long)puVar1 + (6 - uVar80)) =
                               *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                          puVar89 = (undefined2 *)((long)puVar1 + (8 - uVar80));
                        }
                      }
                      uVar66 = (uint)(((ulong)(pcVar65 + uVar63 * 0xfa0a1f00) & 0xffffffff) *
                                      0x68db8bb >> 0x20);
                      uVar100 = uVar66 >> 8;
                      iVar72 = uVar100 * -10000 + (int)(pcVar65 + uVar63 * 0xfa0a1f00);
                      uVar100 = uVar100 * 0x147b >> 0x13;
                      uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                      *puVar89 = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                      puVar89[1] = *(undefined2 *)
                                    (digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                      puVar89[2] = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                      puVar89[3] = *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2)
                      ;
                      pcVar65 = (char *)(puVar89 + 4);
                    }
                    pcVar65[0] = '.';
                    pcVar65[1] = '0';
LAB_01d4f350:
                    puVar106 = (uint *)(pcVar65 + 2);
                  }
                  else {
LAB_01d4d7d1:
                    uVar61 = (ulong)((uint)pcVar65 & 1);
                    iVar72 = uVar66 * 0x4d105 + -0x200a5;
                    if (uVar66 == 1 || uVar63 != 0) {
                      iVar72 = uVar66 * 0x4d105;
                    }
                    iVar72 = iVar72 + -0x1439b7ff >> 0x14;
                    uVar60 = *(ulong *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2ae) * 8);
                    uVar83 = *(long *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2af) * 8) +
                             (ulong)(iVar72 - 1U < 0xffffffc8);
                    bVar105 = ((char)((uint)(iVar72 * -0x3526b) >> 0x10) + (char)uVar66) - 0x32;
                    uVar63 = (ulong)(uVar66 != 1 && uVar63 == 0) + uVar80 * 4 + -2 <<
                             (bVar105 & 0x3f);
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = uVar83;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = uVar63;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = SUB168(auVar17 * auVar37,8);
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = uVar60;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar63;
                    auVar52 = auVar18 * auVar38 + auVar52;
                    uVar63 = uVar80 * 4 << (bVar105 & 0x3f);
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = uVar83;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar63;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = SUB168(auVar19 * auVar39,8);
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = uVar60;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = uVar63;
                    auVar53 = auVar20 * auVar40 + auVar53;
                    uVar101 = auVar53._8_8_;
                    uVar63 = uVar80 * 4 + 2 << (bVar105 & 0x3f);
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = uVar83;
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar63;
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = SUB168(auVar21 * auVar41,8);
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = uVar60;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = uVar63;
                    auVar54 = auVar22 * auVar42 + auVar54;
                    uVar63 = ((ulong)((auVar52 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar52._8_8_) + uVar61;
                    uVar61 = ((ulong)((auVar54 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar54._8_8_) - uVar61;
                    if (uVar101 < 0x28) {
LAB_01d4d927:
                      uVar60 = (auVar53 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0 | uVar101;
                      uVar80 = uVar101 & 0xfffffffffffffffc;
                      bVar109 = true;
                      if (uVar60 <= uVar80 + 2) {
                        bVar109 = (bool)((byte)((uVar101 & 0xffffffff) >> 2) & 0x3f &
                                        uVar60 == uVar80 + 2);
                      }
                      bVar108 = uVar80 + 4 <= uVar61;
                      if (uVar80 < uVar63 == bVar108) {
                        bVar109 = bVar108;
                      }
                      uVar63 = (ulong)bVar109 + (uVar101 >> 2);
                    }
                    else {
                      uVar60 = uVar101 / 0x28;
                      uVar80 = uVar60 * 0x28 + 0x28;
                      if (uVar60 * 0x28 < uVar63 != uVar80 <= uVar61) goto LAB_01d4d927;
                      uVar63 = (uVar60 + 1) - (ulong)(uVar61 < uVar80);
                      iVar72 = iVar72 + 1;
                    }
                    iVar67 = (0x11 - (uint)(uVar63 < 10000000000000000)) -
                             (uint)(uVar63 < 1000000000000000);
                    if (iVar67 + iVar72 + 5U < 0x1b) {
                      uVar66 = iVar67 + iVar72;
                      if ((int)uVar66 < 1) {
                        uVar80 = uVar63 / 100000000;
                        uVar100 = (uint)uVar80;
                        puVar89 = (undefined2 *)
                                  ((long)puVar1 +
                                  (((ulong)(2 - uVar66) + 1) - (ulong)(uVar100 < 100000000)));
                        iVar91 = (int)((uVar80 & 0xffffffff) / 10000);
                        iVar67 = iVar91 * -10000 + uVar100;
                        uVar63 = uVar80 * 0xfa0a1f00 + uVar63;
                        iVar72 = (int)(((uVar80 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar72 * 0x29) >> 0xc;
                        uVar92 = uVar96 * -100 + iVar72;
                        uVar86 = iVar72 * -100 + iVar91;
                        *(char *)((long)puVar1 + (ulong)(2 - uVar66)) = (char)uVar96 + '0';
                        uVar80 = (ulong)(uVar92 < 10 && uVar100 < 100000000);
                        *puVar89 = *(undefined2 *)(digit_table + uVar80 + uVar92 * 2);
                        *(undefined2 *)((long)puVar89 + (2 - uVar80)) =
                             *(undefined2 *)(digit_table + uVar86 * 2);
                        iVar72 = (int)uVar63;
                        if (iVar72 == 0) {
                          if (iVar67 == 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar86 != 0) {
                              uVar63 = 0;
                            }
                            uVar63 = uVar63 + (byte)dec_trailing_zero_table[uVar86];
                            lVar97 = 4;
                          }
                          else {
                            uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                            uVar86 = uVar100 * -100 + iVar67;
                            *(undefined2 *)((long)puVar89 + (4 - uVar80)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                            *(undefined2 *)((long)puVar89 + (6 - uVar80)) =
                                 *(undefined2 *)(digit_table + uVar86 * 2);
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar100] + 2;
                            if (uVar86 != 0) {
                              uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar86];
                            }
                            lVar97 = 8;
                          }
                          uVar63 = lVar97 - uVar63;
                        }
                        else {
                          uVar92 = (uint)(iVar67 * 0x147b) >> 0x13;
                          uVar100 = (uint)((uVar63 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar100 >> 8;
                          uVar86 = uVar96 * 0x147b >> 0x13;
                          uVar63 = (ulong)uVar86;
                          uVar100 = uVar86 * -100 + (uVar100 >> 8);
                          *(undefined2 *)((long)puVar89 + (4 - uVar80)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar89 + (6 - uVar80)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar67) * 2);
                          *(undefined2 *)((long)puVar89 + (8 - uVar80)) =
                               *(undefined2 *)(digit_table + uVar63 * 2);
                          *(undefined2 *)((long)puVar89 + (10 - uVar80)) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          iVar72 = uVar96 * -10000 + iVar72;
                          if (iVar72 == 0) {
                            lVar97 = 0xc;
                          }
                          else {
                            uVar100 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar63 = (ulong)uVar100;
                            uVar100 = uVar100 * -100 + iVar72;
                            *(undefined2 *)((long)puVar89 + (0xc - uVar80)) =
                                 *(undefined2 *)(digit_table + uVar63 * 2);
                            *(undefined2 *)((long)puVar89 + (0xe - uVar80)) =
                                 *(undefined2 *)(digit_table + uVar100 * 2);
                            lVar97 = 0x10;
                          }
                          uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar63] + 2;
                          if (uVar100 != 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar100];
                          }
                          uVar63 = lVar97 - uVar63;
                        }
                        puVar106 = (uint *)((long)puVar89 + ((uVar63 & 0xffffffff) - uVar80));
                        *(undefined2 *)puVar1 = 0x2e30;
                        if ((int)uVar66 < 0) {
                          uVar100 = -uVar66;
                          if ((int)-uVar66 < 2) {
                            uVar100 = 1;
                          }
                          switchD_0105b559::default
                                    ((undefined2 *)((long)puVar1 + 2),0x30,(ulong)uVar100);
                        }
                      }
                      else {
                        uVar80 = uVar63 / 100000000;
                        uVar100 = (uint)uVar80;
                        puVar89 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar100 < 100000000)));
                        iVar91 = (int)((uVar80 & 0xffffffff) / 10000);
                        iVar67 = iVar91 * -10000 + uVar100;
                        uVar63 = uVar80 * 0xfa0a1f00 + uVar63;
                        iVar72 = (int)(((uVar80 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar72 * 0x29) >> 0xc;
                        uVar92 = uVar96 * -100 + iVar72;
                        uVar86 = iVar72 * -100 + iVar91;
                        *puVar1 = 0x30303030;
                        puVar1[1] = 0x30303030;
                        puVar1[2] = 0x30303030;
                        puVar1[3] = 0x30303030;
                        *(undefined8 *)(puVar1 + 4) = 0x3030303030303030;
                        *(char *)((long)puVar1 + 1) = (char)uVar96 + '0';
                        uVar80 = (ulong)(uVar92 < 10 && uVar100 < 100000000);
                        *puVar89 = *(undefined2 *)(digit_table + uVar80 + uVar92 * 2);
                        *(undefined2 *)((long)puVar89 + (2 - uVar80)) =
                             *(undefined2 *)(digit_table + uVar86 * 2);
                        iVar72 = (int)uVar63;
                        if (iVar72 == 0) {
                          if (iVar67 == 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar86 != 0) {
                              uVar63 = 0;
                            }
                            uVar63 = uVar63 + (byte)dec_trailing_zero_table[uVar86];
                            lVar90 = 4;
                          }
                          else {
                            uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                            uVar86 = uVar100 * -100 + iVar67;
                            *(undefined2 *)((long)puVar89 + (4 - uVar80)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                            *(undefined2 *)((long)puVar89 + (6 - uVar80)) =
                                 *(undefined2 *)(digit_table + uVar86 * 2);
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar100] + 2;
                            if (uVar86 != 0) {
                              uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar86];
                            }
                            lVar90 = 8;
                          }
                          uVar63 = lVar90 - uVar63;
                        }
                        else {
                          uVar92 = (uint)(iVar67 * 0x147b) >> 0x13;
                          uVar100 = (uint)((uVar63 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar100 >> 8;
                          uVar86 = uVar96 * 0x147b >> 0x13;
                          uVar63 = (ulong)uVar86;
                          uVar100 = uVar86 * -100 + (uVar100 >> 8);
                          *(undefined2 *)((long)puVar89 + (4 - uVar80)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar89 + (6 - uVar80)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar67) * 2);
                          *(undefined2 *)((long)puVar89 + (8 - uVar80)) =
                               *(undefined2 *)(digit_table + uVar63 * 2);
                          *(undefined2 *)((long)puVar89 + (10 - uVar80)) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          iVar72 = uVar96 * -10000 + iVar72;
                          if (iVar72 == 0) {
                            lVar90 = 0xc;
                          }
                          else {
                            uVar100 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar63 = (ulong)uVar100;
                            uVar100 = uVar100 * -100 + iVar72;
                            *(undefined2 *)((long)puVar89 + (0xc - uVar80)) =
                                 *(undefined2 *)(digit_table + uVar63 * 2);
                            *(undefined2 *)((long)puVar89 + (0xe - uVar80)) =
                                 *(undefined2 *)(digit_table + uVar100 * 2);
                            lVar90 = 0x10;
                          }
                          uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar63] + 2;
                          if (uVar100 != 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar100];
                          }
                          uVar63 = lVar90 - uVar63;
                        }
                        puVar102 = (uint *)((long)puVar89 + ((uVar63 & 0xffffffff) - uVar80));
                        uVar63 = 1;
                        if (1 < (int)uVar66) {
                          uVar63 = (ulong)uVar66;
                        }
                        uVar80 = 0;
                        do {
                          *(byte *)((long)puVar106 + uVar80 + lVar97) =
                               *(byte *)((long)puVar106 + uVar80 + lVar97 + 1);
                          uVar80 = uVar80 + 1;
                        } while (uVar63 != uVar80);
                        puVar106 = (uint *)((undefined1 *)((long)puVar1 + (ulong)uVar66) + 2);
                        *(undefined1 *)((long)puVar1 + (ulong)uVar66) = 0x2e;
                        if (puVar106 < puVar102) {
                          puVar106 = puVar102;
                        }
                      }
                    }
                    else {
                      uVar80 = uVar63 / 100000000;
                      uVar66 = (uint)uVar80;
                      lVar97 = 2 - (ulong)(uVar66 < 100000000);
                      iVar87 = (int)((uVar80 & 0xffffffff) / 10000);
                      iVar85 = iVar87 * -10000 + uVar66;
                      uVar63 = uVar80 * 0xfa0a1f00 + uVar63;
                      iVar91 = (int)(((uVar80 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar92 = (uint)(iVar91 * 0x29) >> 0xc;
                      uVar86 = uVar92 * -100 + iVar91;
                      uVar100 = iVar91 * -100 + iVar87;
                      *(char *)((long)puVar1 + 1) = (char)uVar92 + '0';
                      uVar80 = (ulong)(uVar86 < 10 && uVar66 < 100000000);
                      *(undefined2 *)((long)puVar1 + lVar97) =
                           *(undefined2 *)(digit_table + uVar80 + uVar86 * 2);
                      lVar97 = lVar97 - uVar80;
                      *(undefined2 *)((long)puVar1 + lVar97 + 2) =
                           *(undefined2 *)(digit_table + uVar100 * 2);
                      iVar91 = (int)uVar63;
                      if (iVar91 == 0) {
                        if (iVar85 == 0) {
                          uVar66 = (uint)(byte)dec_trailing_zero_table[uVar86];
                          if (uVar100 != 0) {
                            uVar66 = 0;
                          }
                          uVar66 = 4 - (uVar66 + (byte)dec_trailing_zero_table[uVar100]);
                        }
                        else {
                          uVar66 = (uint)(iVar85 * 0x147b) >> 0x13;
                          uVar100 = uVar66 * -100 + iVar85;
                          *(undefined2 *)((long)puVar1 + lVar97 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + lVar97 + 6) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          uVar66 = (byte)dec_trailing_zero_table[uVar66] + 2;
                          if (uVar100 != 0) {
                            uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                          }
                          uVar66 = 8 - uVar66;
                        }
                      }
                      else {
                        uVar92 = (uint)(iVar85 * 0x147b) >> 0x13;
                        uVar66 = (uint)((uVar63 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar96 = uVar66 >> 8;
                        uVar86 = uVar96 * 0x147b >> 0x13;
                        uVar100 = uVar86 * -100 + (uVar66 >> 8);
                        *(undefined2 *)((long)puVar1 + lVar97 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                        *(undefined2 *)((long)puVar1 + lVar97 + 6) =
                             *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar85) * 2);
                        *(undefined2 *)((long)puVar1 + lVar97 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                        *(undefined2 *)((long)puVar1 + lVar97 + 10) =
                             *(undefined2 *)(digit_table + uVar100 * 2);
                        iVar91 = uVar96 * -10000 + iVar91;
                        if (iVar91 == 0) {
                          uVar66 = (byte)dec_trailing_zero_table[uVar86] + 2;
                          if (uVar100 != 0) {
                            uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                          }
                          iVar91 = 0xc;
                        }
                        else {
                          uVar66 = (uint)(iVar91 * 0x147b) >> 0x13;
                          uVar100 = uVar66 * -100 + iVar91;
                          *(undefined2 *)((long)puVar1 + lVar97 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + lVar97 + 0xe) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          uVar66 = (byte)dec_trailing_zero_table[uVar66] + 2;
                          if (uVar100 != 0) {
                            uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                          }
                          iVar91 = 0x10;
                        }
                        uVar66 = iVar91 - uVar66;
                      }
                      puVar89 = (undefined2 *)
                                ((long)puVar1 +
                                (((ulong)uVar66 + lVar97) - (ulong)((ulong)uVar66 + lVar97 == 2)));
                      uVar100 = (iVar67 + iVar72) - 1;
                      *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                      *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                      *puVar89 = 0x2d65;
                      uVar86 = uVar100 >> 0x1f;
                      pcVar65 = (char *)((long)puVar89 + (ulong)uVar86 + 1);
                      uVar66 = -uVar100;
                      if (0 < (int)uVar100) {
                        uVar66 = uVar100;
                      }
                      if (uVar66 < 100) {
                        *(undefined2 *)pcVar65 =
                             *(undefined2 *)(digit_table + (ulong)(uVar66 < 10) + (ulong)uVar66 * 2)
                        ;
                        pcVar65 = pcVar65 + -(ulong)(uVar66 < 10);
                        goto LAB_01d4f350;
                      }
                      *pcVar65 = (char)(uVar66 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar89 + (ulong)uVar86 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar66 * 0x290 >> 0x10) * 0x7fffff9c + uVar66) * 2);
                      puVar106 = (uint *)((long)puVar89 + (ulong)uVar86 + 4);
                    }
                  }
                }
              }
            }
            if (puVar106 != (uint *)0x0) {
              *(byte *)puVar106 = 0x2c;
              puVar106 = (uint *)((long)puVar106 + 1);
              goto LAB_01d4f367;
            }
            goto LAB_01d4f928;
          }
          if (((uint)uVar63 & 7) == 5) {
            uVar80 = uVar63 >> 8;
            puVar102 = (uint *)(pyVar93->uni).str;
            uVar61 = sVar104;
            puVar88 = puVar77;
            if (puVar77 <= (uint *)((long)puVar106 + uVar80 * 6 + 0x10)) {
              uVar61 = uVar80 * 6 + 0x10;
              uVar60 = sVar104 >> 1;
              if (sVar104 >> 1 <= uVar61) {
                uVar60 = uVar61;
              }
              uVar61 = (uVar60 + 7 & 0xfffffffffffffff8) + sVar104;
              pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,uVar61);
              if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
              puVar88 = (uint *)(pbVar82 + (uVar61 - ((long)local_b8 - (long)puVar77)));
              memmove(puVar88,pbVar82 + ((long)puVar77 - (long)local_e8),
                      (long)local_b8 - (long)puVar77);
              puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
              local_b8 = (uint *)(pbVar82 + uVar61);
              local_e8 = pbVar82;
            }
            if ((puVar99 != enc_table_cpy) || ((pyVar93->tag & 0x18) == 0)) {
              puVar77 = (uint *)(uVar80 + (long)puVar102);
              *(byte *)puVar106 = 0x22;
LAB_01d4d98a:
              lVar97 = (long)puVar77 - (long)puVar102;
              if (0xf < lVar97) {
                lVar90 = 0;
                do {
                  puVar64 = (uint *)((long)puVar106 + lVar90 + 1);
                  puVar78 = (uint *)((long)puVar102 + lVar90);
                  if (puVar99[*(byte *)((long)puVar102 + lVar90)] != '\0') goto LAB_01d4dd42;
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 1)] != '\0') {
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 1);
                    puVar78 = (uint *)((long)puVar102 + lVar90);
                    goto LAB_01d4db6b;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 2)] != '\0') {
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 1);
                    puVar78 = (uint *)((long)puVar102 + lVar90);
                    goto LAB_01d4db87;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 3)] != '\0') {
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 1);
                    puVar78 = (uint *)((long)puVar102 + lVar90);
                    goto LAB_01d4dba7;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 4)] != '\0') {
                    puVar78 = (uint *)((byte *)((long)puVar102 + lVar90) + 4);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 5);
                    *(undefined4 *)((long)puVar106 + lVar90 + 1) =
                         *(undefined4 *)((long)puVar102 + lVar90);
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 5)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 5);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 6);
                    *(byte *)((long)puVar64 + -1) = pbVar82[4];
                    *(undefined4 *)((long)puVar64 + -5) = *(undefined4 *)pbVar82;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 6)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 6);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 7);
                    *(ushort *)((long)puVar64 + -2) = *(ushort *)(pbVar82 + 4);
                    *(undefined4 *)((long)puVar64 + -6) = *(undefined4 *)pbVar82;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 7)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 7);
                    uVar4 = *(undefined4 *)pbVar82;
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 8);
                    *(undefined4 *)((long)puVar106 + lVar90 + 4) = *(undefined4 *)(pbVar82 + 3);
                    *(undefined4 *)((long)puVar106 + lVar90 + 1) = uVar4;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 8)] != '\0') {
                    puVar78 = (uint *)((byte *)((long)puVar102 + lVar90) + 8);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 9);
                    *(undefined8 *)((long)puVar106 + lVar90 + 1) =
                         *(undefined8 *)((long)puVar102 + lVar90);
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 9)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 9);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 10);
                    *(byte *)((long)puVar64 + -1) = pbVar82[8];
                    *(undefined8 *)((long)puVar64 + -9) = *(undefined8 *)pbVar82;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 10)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 10);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 0xb);
                    *(ushort *)((long)puVar64 + -2) = *(ushort *)(pbVar82 + 8);
                    *(undefined8 *)((long)puVar64 + -10) = *(undefined8 *)pbVar82;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 0xb)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 0xb);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 0xc);
                    puVar64[-1] = *(uint *)(pbVar82 + 7);
                    *(undefined8 *)((long)puVar64 + -0xb) = *(undefined8 *)pbVar82;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 0xc)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 0xc);
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 0xd);
                    puVar64[-1] = *(uint *)(pbVar82 + 8);
                    *(undefined8 *)(puVar64 + -3) = *(undefined8 *)pbVar82;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 0xd)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 0xd);
                    uVar73 = *(undefined8 *)pbVar82;
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 0xe);
                    *(undefined8 *)((long)puVar106 + lVar90 + 6) = *(undefined8 *)(pbVar82 + 5);
                    *(undefined8 *)((long)puVar106 + lVar90 + 1) = uVar73;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 0xe)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 0xe);
                    uVar73 = *(undefined8 *)pbVar82;
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 0xf);
                    *(undefined8 *)((long)puVar106 + lVar90 + 7) = *(undefined8 *)(pbVar82 + 6);
                    *(undefined8 *)((long)puVar106 + lVar90 + 1) = uVar73;
                    goto LAB_01d4dd42;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar90 + 0xf)] != '\0') {
                    pbVar82 = (byte *)((long)puVar102 + lVar90);
                    puVar78 = (uint *)(pbVar82 + 0xf);
                    uVar73 = *(undefined8 *)pbVar82;
                    puVar64 = (uint *)((long)puVar106 + lVar90 + 0x10);
                    *(undefined8 *)((long)puVar106 + lVar90 + 8) = *(undefined8 *)(pbVar82 + 7);
                    *(undefined8 *)((long)puVar106 + lVar90 + 1) = uVar73;
                    goto LAB_01d4dd42;
                  }
                  uVar66 = puVar78[1];
                  uVar100 = puVar78[2];
                  uVar86 = puVar78[3];
                  *puVar64 = *puVar78;
                  *(uint *)((long)puVar106 + lVar90 + 5) = uVar66;
                  *(uint *)((long)puVar106 + lVar90 + 9) = uVar100;
                  *(uint *)((long)puVar106 + lVar90 + 0xd) = uVar86;
                  lVar90 = lVar90 + 0x10;
                  lVar97 = lVar97 + -0x10;
                } while (0xf < lVar97);
                puVar106 = (uint *)((long)puVar106 + lVar90);
                puVar102 = (uint *)((long)puVar102 + lVar90);
              }
              puVar64 = (uint *)((long)puVar106 + 1);
              puVar78 = puVar102;
              for (lVar97 = (long)puVar77 - (long)puVar102; 3 < lVar97; lVar97 = lVar97 + -4) {
                if (puVar99[(byte)*puVar78] != '\0') goto LAB_01d4dd42;
                if (puVar99[*(byte *)((long)puVar78 + 1)] != '\0') goto LAB_01d4db6b;
                if (puVar99[*(byte *)((long)puVar78 + 2)] != '\0') goto LAB_01d4db87;
                if (puVar99[*(byte *)((long)puVar78 + 3)] != '\0') goto LAB_01d4dba7;
                *puVar64 = *puVar78;
                puVar64 = puVar64 + 1;
                puVar78 = puVar78 + 1;
              }
              while( true ) {
                if (puVar77 <= puVar78) goto switchD_01d4dd6b_default;
                uVar66 = *puVar78;
                if (puVar99[(byte)uVar66] != '\0') break;
                puVar78 = (uint *)((long)puVar78 + 1);
                *(byte *)puVar64 = (byte)uVar66;
                puVar64 = (uint *)((long)puVar64 + 1);
              }
              goto LAB_01d4dd42;
            }
            *(byte *)puVar106 = 0x22;
            puVar106 = (uint *)((long)puVar106 + 1);
            if (0xfff < uVar63) {
              do {
                uVar66 = puVar102[1];
                uVar100 = puVar102[2];
                uVar86 = puVar102[3];
                *puVar106 = *puVar102;
                puVar106[1] = uVar66;
                puVar106[2] = uVar100;
                puVar106[3] = uVar86;
                puVar106 = puVar106 + 4;
                puVar102 = puVar102 + 4;
                uVar80 = uVar80 - 0x10;
              } while (0xf < uVar80);
            }
            for (; 3 < uVar80; uVar80 = uVar80 - 4) {
              *puVar106 = *puVar102;
              puVar106 = puVar106 + 1;
              puVar102 = puVar102 + 1;
            }
            if (uVar80 != 0) {
              uVar63 = 0;
              do {
                *(byte *)((long)puVar106 + uVar63) = *(byte *)((long)puVar102 + uVar63);
                uVar63 = uVar63 + 1;
              } while (uVar80 != uVar63);
              puVar106 = (uint *)((long)puVar106 + uVar63);
            }
            *(byte *)puVar106 = 0x22;
            pbVar82 = (byte *)((long)puVar106 + 1);
            goto LAB_01d4ef5d;
          }
          if ((~(byte)uVar63 & 6) == 0) {
            if (puVar77 <= puVar106 + 4) {
              uVar80 = sVar104 >> 1;
              if (uVar80 < 0x11) {
                uVar80 = 0x10;
              }
              sVar81 = (uVar80 + 7 & 0xfffffffffffffff8) + sVar104;
              pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,sVar81);
              if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
              sVar74 = (long)local_b8 - (long)puVar77;
              memmove(pbVar82 + (sVar81 - sVar74),pbVar82 + ((long)puVar77 - (long)local_e8),sVar74)
              ;
              puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
              local_b8 = (uint *)(pbVar82 + sVar81);
              sVar104 = sVar81;
              puVar77 = (uint *)(pbVar82 + (sVar81 - sVar74));
              local_e8 = pbVar82;
            }
            if (0xff < uVar63) {
              bVar109 = bVar105 == 7;
              local_d8 = (ulong)bVar109;
              *(ulong *)(puVar77 + -2) = uVar84 + lVar107 * 2;
              lVar107 = (uVar63 >> 8) << bVar109;
              puVar77 = puVar77 + -2;
              *(byte *)puVar106 = bVar109 << 5 | 0x5b;
              puVar106 = (uint *)((long)puVar106 + 1);
              pyVar93 = pyVar93 + 1;
              goto LAB_01d4d540;
            }
            bVar105 = (bVar105 == 7) * ' ';
            *(byte *)puVar106 = bVar105 + 0x5b;
            *(byte *)((long)puVar106 + 1) = bVar105 | 0x5d;
            *(byte *)((long)puVar106 + 2) = 0x2c;
            puVar106 = (uint *)((long)puVar106 + 3);
          }
          else {
            if (bVar105 == 1) {
              uVar63 = uVar63 >> 8;
              pvVar9 = (pyVar93->uni).ptr;
              if (puVar77 <= (uint *)((long)puVar106 + uVar63 + 2)) {
                uVar80 = sVar104 >> 1;
                if (sVar104 >> 1 <= uVar63 + 2) {
                  uVar80 = uVar63 + 2;
                }
                sVar81 = (uVar80 + 7 & 0xfffffffffffffff8) + sVar104;
                pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,sVar81);
                if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                sVar74 = (long)local_b8 - (long)puVar77;
                memmove(pbVar82 + (sVar81 - sVar74),pbVar82 + ((long)puVar77 - (long)local_e8),
                        sVar74);
                puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
                local_b8 = (uint *)(pbVar82 + sVar81);
                puVar77 = (uint *)(pbVar82 + (sVar81 - sVar74));
                sVar104 = sVar81;
                local_e8 = pbVar82;
              }
              switchD_015ff80e::default(puVar106,pvVar9,uVar63);
              pbVar82 = (byte *)((long)puVar106 + uVar63);
              puVar106 = (uint *)(pbVar82 + 1);
              *pbVar82 = 0x2c;
              goto LAB_01d4f367;
            }
            uVar66 = (uint)uVar63 & 7;
            if (uVar66 == 2) {
              uVar63 = sVar104;
              puVar102 = puVar77;
              if (puVar77 <= puVar106 + 4) {
                uVar63 = sVar104 >> 1;
                if (uVar63 < 0x11) {
                  uVar63 = 0x10;
                }
                uVar63 = (uVar63 + 7 & 0xfffffffffffffff8) + sVar104;
                pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,uVar63);
                if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                puVar102 = (uint *)(pbVar82 + (uVar63 - ((long)local_b8 - (long)puVar77)));
                memmove(puVar102,pbVar82 + ((long)puVar77 - (long)local_e8),
                        (long)local_b8 - (long)puVar77);
                puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
                local_b8 = (uint *)(pbVar82 + uVar63);
                local_e8 = pbVar82;
              }
              puVar106[0] = 0x6c6c756e;
              puVar106[1] = 0xa2c;
              puVar106 = (uint *)((long)puVar106 + 5);
              sVar104 = uVar63;
              puVar77 = puVar102;
            }
            else {
              if (uVar66 != 3) goto LAB_01d4f86d;
              uVar63 = sVar104;
              puVar102 = puVar77;
              if (puVar77 <= puVar106 + 4) {
                uVar63 = sVar104 >> 1;
                if (uVar63 < 0x11) {
                  uVar63 = 0x10;
                }
                uVar63 = (uVar63 + 7 & 0xfffffffffffffff8) + sVar104;
                pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,uVar63);
                if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                puVar102 = (uint *)(pbVar82 + (uVar63 - ((long)local_b8 - (long)puVar77)));
                memmove(puVar102,pbVar82 + ((long)puVar77 - (long)local_e8),
                        (long)local_b8 - (long)puVar77);
                puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
                local_b8 = (uint *)(pbVar82 + uVar63);
                local_e8 = pbVar82;
              }
              bVar109 = (pyVar93->tag & 0x18) != 0;
              uVar73 = 0xa2c65736c6166;
              if (bVar109) {
                uVar73 = 0xa2c65757274;
              }
              *(undefined8 *)puVar106 = uVar73;
              puVar106 = (uint *)((long)puVar106 + (6 - (ulong)bVar109));
              sVar104 = uVar63;
              puVar77 = puVar102;
            }
          }
          goto LAB_01d4f367;
        }
      }
      else {
        puVar99 = enc_table_cpy;
        if ((flg & 2) == 0) {
          puVar75 = enc_table_cpy_slash;
        }
        else {
          puVar99 = enc_table_esc;
          puVar75 = enc_table_esc_slash;
        }
        if ((flg & 4) == 0) {
          puVar75 = puVar99;
        }
        local_e0 = ((val->uni).u64 & 0xfffffffffffffff0) * 2 + 0x40;
        local_e8 = (byte *)(*p_Var5)(pvVar7,local_e0);
        if (local_e8 != (byte *)0x0) {
          lVar107 = (ulong)((flg & 0x40) == 0) * 2 + 2;
          uVar66 = ~(uint)val->tag;
          bVar109 = (uVar66 & 7) == 0;
          local_40 = (ulong)CONCAT31((int3)(uVar66 >> 8),bVar109);
          lVar90 = (val->tag >> 8) << bVar109;
          *local_e8 = bVar109 << 5 | 0x5b;
          puVar77 = (uint *)(local_e8 + 2);
          local_e8[1] = 10;
          pyVar93 = val + 1;
          puVar59 = (ulong *)(local_e8 + local_e0);
          lVar97 = 1;
          local_90 = puVar59;
LAB_01d4acee:
          do {
            uVar80 = local_40 & 0xff;
            uVar84 = lVar97 * 4 + 0x20;
            uVar63 = lVar97 * 4 + 0x10;
            puVar79 = puVar59;
LAB_01d4ad1f:
            uVar61 = pyVar93->tag;
            bVar105 = (byte)uVar61 & 7;
            uVar66 = (uint)uVar80;
            uVar100 = (uint)lVar90;
            puVar59 = puVar79;
            if (bVar105 == 4) {
              uVar61 = uVar84;
              if ((uVar100 & uVar66) != 0) {
                uVar61 = 0x20;
              }
              if (puVar79 <= (ulong *)(uVar61 + (long)puVar77)) {
                uVar60 = local_e0 >> 1;
                if (local_e0 >> 1 <= uVar61) {
                  uVar60 = uVar61;
                }
                sVar104 = (uVar60 + 7 & 0xfffffffffffffff8) + local_e0;
                pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
                if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                sVar74 = (long)local_90 - (long)puVar79;
                memmove(pbVar82 + (sVar104 - sVar74),pbVar82 + ((long)puVar79 - (long)local_e8),
                        sVar74);
                puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
                local_90 = (ulong *)(pbVar82 + sVar104);
                puVar59 = (ulong *)(pbVar82 + (sVar104 - sVar74));
                local_e0 = sVar104;
                local_e8 = pbVar82;
              }
              lVar69 = lVar97;
              if (lVar97 != 0 && (uVar100 & uVar66) == 0) {
                do {
                  puVar106 = (uint *)(lVar107 + (long)puVar77);
                  *puVar77 = 0x20202020;
                  lVar69 = lVar69 + -1;
                  puVar77 = puVar106;
                } while (lVar69 != 0);
              }
              pcVar65 = (char *)(pyVar93->uni).u64;
              uVar66 = (uint)((ulong)pcVar65 >> 0x20);
              if ((pyVar93->tag & 0x10) == 0) {
                uVar66 = uVar66 >> 0x1f & (uint)(pyVar93->tag >> 3);
                *(byte *)puVar77 = 0x2d;
                pcVar68 = (char *)-(long)pcVar65;
                if (uVar66 == 0) {
                  pcVar68 = pcVar65;
                }
                pbVar82 = (byte *)((ulong)uVar66 + (long)puVar77);
                if (pcVar68 < (char *)0x5f5e100) {
                  if (pcVar68 < (char *)0x64) {
                    *(undefined2 *)pbVar82 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar68 < (char *)0xa) + (long)pcVar68 * 2);
                    puVar77 = (uint *)(pbVar82 + (2 - (ulong)(pcVar68 < (char *)0xa)));
                  }
                  else {
                    iVar72 = (int)pcVar68;
                    if (pcVar68 < (char *)0x2710) {
                      uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar61 = (ulong)(pcVar68 < (char *)0x3e8);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar61 + (ulong)uVar66 * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                      puVar77 = (uint *)(pbVar82 + (4 - uVar61));
                    }
                    else if (pcVar68 < (char *)0xf4240) {
                      iVar72 = (int)((ulong)((long)pcVar68 * 0x68db9) >> 0x20) * -10000 + iVar72;
                      uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar61 = (ulong)(pcVar68 < (char *)0x186a0);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)
                            (digit_table + uVar61 + ((ulong)((long)pcVar68 * 0x68db9) >> 0x20) * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar61)) =
                           *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                      *(undefined2 *)(pbVar82 + (4 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                      puVar77 = (uint *)(pbVar82 + (6 - uVar61));
                    }
                    else {
                      uVar66 = (uint)((ulong)((long)pcVar68 * 0x68db8bb) >> 0x20);
                      uVar100 = uVar66 >> 8;
                      iVar72 = uVar100 * -10000 + iVar72;
                      uVar100 = uVar100 * 0x147b >> 0x13;
                      uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar61 = (ulong)(pcVar68 < "stampNSERKS1_EEEE");
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar61 + (ulong)uVar100 * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                      *(undefined2 *)(pbVar82 + (4 - uVar61)) =
                           *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                      *(undefined2 *)(pbVar82 + (6 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                      puVar77 = (uint *)(pbVar82 + (8 - uVar61));
                    }
                  }
                }
                else {
                  uVar61 = (ulong)pcVar68 / 100000000;
                  pcVar65 = pcVar68 + uVar61 * 0xfa0a1f00;
                  iVar72 = (int)uVar61;
                  if (pcVar68 < (char *)0x2386f26fc10000) {
                    if (pcVar68 < (char *)0x2540be400) {
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar68 < (char *)0x3b9aca00) + uVar61 * 2);
                      pbVar82 = pbVar82 + (2 - (ulong)(pcVar68 < (char *)0x3b9aca00));
                    }
                    else if (pcVar68 < (char *)0xe8d4a51000) {
                      uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar61 = (ulong)(pcVar68 < (char *)0x174876e800);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar61 + (ulong)uVar66 * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                      pbVar82 = pbVar82 + (4 - uVar61);
                    }
                    else if (pcVar68 < (char *)0x5af3107a4000) {
                      iVar72 = (int)(uVar61 * 0x68db9 >> 0x20) * -10000 + iVar72;
                      uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar60 = (ulong)(pcVar68 < (char *)0x9184e72a000);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar60 + (uVar61 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar60)) =
                           *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                      *(undefined2 *)(pbVar82 + (4 - uVar60)) =
                           *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                      pbVar82 = pbVar82 + (6 - uVar60);
                    }
                    else {
                      uVar66 = (uint)(uVar61 * 0x68db8bb >> 0x20);
                      uVar100 = uVar66 >> 8;
                      iVar72 = uVar100 * -10000 + iVar72;
                      uVar100 = uVar100 * 0x147b >> 0x13;
                      uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                      uVar61 = (ulong)(pcVar68 < (char *)0x38d7ea4c68000);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar61 + (ulong)uVar100 * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                      *(undefined2 *)(pbVar82 + (4 - uVar61)) =
                           *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                      *(undefined2 *)(pbVar82 + (6 - uVar61)) =
                           *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                      pbVar82 = pbVar82 + (8 - uVar61);
                    }
                    uVar66 = (uint)(((ulong)pcVar65 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar100 = uVar66 >> 8;
                    iVar72 = uVar100 * -10000 + (int)pcVar65;
                    uVar100 = uVar100 * 0x147b >> 0x13;
                    uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                    *(undefined2 *)(pbVar82 + 2) =
                         *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                    *(undefined2 *)(pbVar82 + 4) = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                    *(undefined2 *)(pbVar82 + 6) =
                         *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
                    puVar77 = (uint *)(pbVar82 + 8);
                  }
                  else {
                    uVar61 = (ulong)pcVar68 / 1000000000000;
                    iVar67 = (int)uVar61;
                    if (pcVar68 < (char *)0xde0b6b3a7640000) {
                      iVar91 = (int)(uVar61 * 0x68db9 >> 0x20) * -10000 + iVar67;
                      uVar66 = (uint)(iVar91 * 0x147b) >> 0x13;
                      uVar60 = (ulong)(pcVar68 < (char *)0x16345785d8a0000);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar60 + (uVar61 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar60)) =
                           *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                      *(undefined2 *)(pbVar82 + (4 - uVar60)) =
                           *(undefined2 *)(digit_table + (uVar66 * -100 + iVar91) * 2);
                      lVar69 = 6 - uVar60;
                    }
                    else {
                      uVar66 = (uint)(uVar61 / 10000);
                      iVar91 = uVar66 * -10000 + iVar67;
                      uVar66 = uVar66 / 100;
                      uVar100 = (uint)(iVar91 * 0x147b) >> 0x13;
                      uVar60 = (ulong)(pcVar68 < (char *)0x8ac7230489e80000);
                      *(undefined2 *)pbVar82 =
                           *(undefined2 *)(digit_table + uVar60 + (ulong)uVar66 * 2);
                      *(undefined2 *)(pbVar82 + (2 - uVar60)) =
                           *(undefined2 *)
                            (digit_table + (uVar66 * -100 + (int)(uVar61 / 10000)) * 2);
                      *(undefined2 *)(pbVar82 + (4 - uVar60)) =
                           *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                      *(undefined2 *)(pbVar82 + (6 - uVar60)) =
                           *(undefined2 *)(digit_table + (uVar100 * -100 + iVar91) * 2);
                      lVar69 = 8 - uVar60;
                    }
                    pbVar82 = pbVar82 + lVar69;
                    iVar72 = iVar72 + iVar67 * -10000;
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                    *(undefined2 *)(pbVar82 + 2) =
                         *(undefined2 *)(digit_table + (uVar66 * 0x7fffff9c + iVar72) * 2);
                    uVar66 = (uint)(((ulong)pcVar65 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar100 = uVar66 >> 8;
                    iVar72 = uVar100 * -10000 + (int)pcVar65;
                    uVar100 = uVar100 * 0x147b >> 0x13;
                    uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                    *(undefined2 *)(pbVar82 + 4) = *(undefined2 *)(digit_table + (ulong)uVar100 * 2)
                    ;
                    *(undefined2 *)(pbVar82 + 6) =
                         *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                    *(undefined2 *)(pbVar82 + 8) = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                    *(undefined2 *)(pbVar82 + 10) =
                         *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
                    puVar77 = (uint *)(pbVar82 + 0xc);
                  }
                }
              }
              else {
                uVar61 = (ulong)pcVar65 & 0xfffffffffffff;
                uVar66 = uVar66 >> 0x14 & 0x7ff;
                if (uVar66 == 0x7ff) {
                  if ((flg & 0x10) == 0) {
                    if ((flg & 8) == 0) {
                      puVar77 = (uint *)0x0;
                    }
                    else if (uVar61 == 0) {
                      *(byte *)puVar77 = 0x2d;
                      puVar103 = (undefined8 *)((long)puVar77 - ((long)pcVar65 >> 0x3f));
                      *puVar103 = 0x7974696e69666e49;
                      puVar77 = (uint *)(puVar103 + 1);
                    }
                    else {
                      *puVar77 = 0x4e614e;
                      puVar77 = (uint *)((long)puVar77 + 3);
                    }
                  }
                  else {
                    *puVar77 = 0x6c6c756e;
                    puVar77 = puVar77 + 1;
                  }
                }
                else {
                  *(byte *)puVar77 = 0x2d;
                  lVar69 = -((long)pcVar65 >> 0x3f);
                  puVar1 = (undefined4 *)((long)puVar77 + lVar69);
                  if (((ulong)pcVar65 & 0x7fffffffffffffff) == 0) {
                    *puVar1 = 0x302e30;
                    puVar77 = (uint *)((long)puVar1 + 3);
                  }
                  else if (uVar66 == 0) {
                    yyjson_val_write_opts();
                    puVar77 = local_78;
                  }
                  else {
                    uVar60 = uVar61 + 0x10000000000000;
                    if (uVar66 - 0x3ff < 0x35) {
                      lVar62 = 0;
                      if (uVar60 != 0) {
                        for (; (uVar60 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
                        }
                      }
                      if (0x433 - uVar66 <= (uint)lVar62) {
                        pcVar65 = (char *)(uVar60 >> ((byte)(0x433 - uVar66) & 0x3f));
                        if (pcVar65 < (char *)0x5f5e100) {
                          if (pcVar65 < (char *)0x64) {
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)
                                  (digit_table + (ulong)(pcVar65 < (char *)0xa) + (long)pcVar65 * 2)
                            ;
                            puVar89 = (undefined2 *)
                                      ((long)puVar1 + (2 - (ulong)(pcVar65 < (char *)0xa)));
                          }
                          else {
                            iVar72 = (int)pcVar65;
                            if (pcVar65 < (char *)0x2710) {
                              uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar61 = (ulong)(pcVar65 < (char *)0x3e8);
                              *(undefined2 *)puVar1 =
                                   *(undefined2 *)(digit_table + uVar61 + (ulong)uVar66 * 2);
                              *(undefined2 *)((long)puVar1 + (2 - uVar61)) =
                                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                              puVar89 = (undefined2 *)((long)puVar1 + (4 - uVar61));
                            }
                            else if (pcVar65 < (char *)0xf4240) {
                              iVar72 = (int)((ulong)((long)pcVar65 * 0x68db9) >> 0x20) * -10000 +
                                       iVar72;
                              uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar61 = (ulong)(pcVar65 < (char *)0x186a0);
                              *(undefined2 *)puVar1 =
                                   *(undefined2 *)
                                    (digit_table +
                                    uVar61 + ((ulong)((long)pcVar65 * 0x68db9) >> 0x20) * 2);
                              *(undefined2 *)((long)puVar1 + (2 - uVar61)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                              *(undefined2 *)((long)puVar1 + (4 - uVar61)) =
                                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                              puVar89 = (undefined2 *)((long)puVar1 + (6 - uVar61));
                            }
                            else {
                              uVar66 = (uint)((ulong)((long)pcVar65 * 0x68db8bb) >> 0x20);
                              uVar100 = uVar66 >> 8;
                              iVar72 = uVar100 * -10000 + iVar72;
                              uVar100 = uVar100 * 0x147b >> 0x13;
                              uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar61 = (ulong)(pcVar65 < "stampNSERKS1_EEEE");
                              *(undefined2 *)puVar1 =
                                   *(undefined2 *)(digit_table + uVar61 + (ulong)uVar100 * 2);
                              *(undefined2 *)((long)puVar1 + (2 - uVar61)) =
                                   *(undefined2 *)
                                    (digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                              *(undefined2 *)((long)puVar1 + (4 - uVar61)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                              *(undefined2 *)((long)puVar1 + (6 - uVar61)) =
                                   *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                              puVar89 = (undefined2 *)((long)puVar1 + (8 - uVar61));
                            }
                          }
                        }
                        else {
                          auVar16._8_8_ = 0;
                          auVar16._0_8_ = pcVar65;
                          uVar61 = SUB168(auVar16 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                          if (pcVar65 < (char *)0x2540be400) {
                            *(undefined2 *)puVar1 =
                                 *(undefined2 *)
                                  (digit_table + (ulong)(pcVar65 < (char *)0x3b9aca00) + uVar61 * 2)
                            ;
                            puVar89 = (undefined2 *)
                                      ((long)puVar1 + (2 - (ulong)(pcVar65 < (char *)0x3b9aca00)));
                          }
                          else {
                            iVar72 = (int)uVar61;
                            if (pcVar65 < (char *)0xe8d4a51000) {
                              uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar60 = (ulong)(pcVar65 < (char *)0x174876e800);
                              *(undefined2 *)puVar1 =
                                   *(undefined2 *)(digit_table + uVar60 + (ulong)uVar66 * 2);
                              *(undefined2 *)((long)puVar1 + (2 - uVar60)) =
                                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                              puVar89 = (undefined2 *)((long)puVar1 + (4 - uVar60));
                            }
                            else if (pcVar65 < (char *)0x5af3107a4000) {
                              iVar72 = (int)(uVar61 * 0x68db9 >> 0x20) * -10000 + iVar72;
                              uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar60 = (ulong)(pcVar65 < (char *)0x9184e72a000);
                              *(undefined2 *)puVar1 =
                                   *(undefined2 *)
                                    (digit_table + uVar60 + (uVar61 * 0x68db9 >> 0x20) * 2);
                              *(undefined2 *)((long)puVar1 + (2 - uVar60)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                              *(undefined2 *)((long)puVar1 + (4 - uVar60)) =
                                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                              puVar89 = (undefined2 *)((long)puVar1 + (6 - uVar60));
                            }
                            else {
                              uVar66 = (uint)(uVar61 * 0x68db8bb >> 0x20);
                              uVar100 = uVar66 >> 8;
                              iVar72 = uVar100 * -10000 + iVar72;
                              uVar100 = uVar100 * 0x147b >> 0x13;
                              uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                              uVar60 = (ulong)(pcVar65 < (char *)0x38d7ea4c68000);
                              *(undefined2 *)puVar1 =
                                   *(undefined2 *)(digit_table + uVar60 + (ulong)uVar100 * 2);
                              *(undefined2 *)((long)puVar1 + (2 - uVar60)) =
                                   *(undefined2 *)
                                    (digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                              *(undefined2 *)((long)puVar1 + (4 - uVar60)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                              *(undefined2 *)((long)puVar1 + (6 - uVar60)) =
                                   *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                              puVar89 = (undefined2 *)((long)puVar1 + (8 - uVar60));
                            }
                          }
                          uVar66 = (uint)(((ulong)(pcVar65 + uVar61 * 0xfa0a1f00) & 0xffffffff) *
                                          0x68db8bb >> 0x20);
                          uVar100 = uVar66 >> 8;
                          iVar72 = uVar100 * -10000 + (int)(pcVar65 + uVar61 * 0xfa0a1f00);
                          uVar100 = uVar100 * 0x147b >> 0x13;
                          uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                          *puVar89 = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                          puVar89[1] = *(undefined2 *)
                                        (digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                          puVar89[2] = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                          puVar89[3] = *(undefined2 *)
                                        (digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
                          puVar89 = puVar89 + 4;
                        }
                        *puVar89 = 0x302e;
                        puVar77 = (uint *)(puVar89 + 1);
                        goto LAB_01d4c9b5;
                      }
                    }
                    uVar101 = (ulong)((uint)pcVar65 & 1);
                    iVar72 = uVar66 * 0x4d105 + -0x200a5;
                    if (uVar66 == 1 || uVar61 != 0) {
                      iVar72 = uVar66 * 0x4d105;
                    }
                    iVar72 = iVar72 + -0x1439b7ff >> 0x14;
                    uVar83 = *(ulong *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2ae) * 8);
                    uVar98 = *(long *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2af) * 8) +
                             (ulong)(iVar72 - 1U < 0xffffffc8);
                    bVar105 = ((char)((uint)(iVar72 * -0x3526b) >> 0x10) + (char)uVar66) - 0x32;
                    uVar61 = (ulong)(uVar66 != 1 && uVar61 == 0) + uVar60 * 4 + -2 <<
                             (bVar105 & 0x3f);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = uVar98;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = uVar61;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = SUB168(auVar10 * auVar31,8);
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = uVar83;
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = uVar61;
                    auVar49 = auVar11 * auVar32 + auVar49;
                    uVar61 = uVar60 * 4 << (bVar105 & 0x3f);
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = uVar98;
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = uVar61;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = SUB168(auVar12 * auVar33,8);
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = uVar83;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = uVar61;
                    auVar50 = auVar13 * auVar34 + auVar50;
                    uVar94 = auVar50._8_8_;
                    uVar61 = uVar60 * 4 + 2 << (bVar105 & 0x3f);
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = uVar98;
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar61;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = SUB168(auVar14 * auVar35,8);
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = uVar83;
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = uVar61;
                    auVar51 = auVar15 * auVar36 + auVar51;
                    uVar61 = ((ulong)((auVar49 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar49._8_8_) + uVar101;
                    uVar101 = ((ulong)((auVar51 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar51._8_8_) - uVar101;
                    if (uVar94 < 0x28) {
LAB_01d4b1a7:
                      uVar83 = (auVar50 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0 | uVar94;
                      uVar60 = uVar94 & 0xfffffffffffffffc;
                      bVar109 = true;
                      if (uVar83 <= uVar60 + 2) {
                        bVar109 = (bool)((byte)((uVar94 & 0xffffffff) >> 2) & 0x3f &
                                        uVar83 == uVar60 + 2);
                      }
                      bVar108 = uVar60 + 4 <= uVar101;
                      if (uVar60 < uVar61 == bVar108) {
                        bVar109 = bVar108;
                      }
                      uVar61 = (ulong)bVar109 + (uVar94 >> 2);
                    }
                    else {
                      uVar83 = uVar94 / 0x28;
                      uVar60 = uVar83 * 0x28 + 0x28;
                      if (uVar83 * 0x28 < uVar61 != uVar60 <= uVar101) goto LAB_01d4b1a7;
                      uVar61 = (uVar83 + 1) - (ulong)(uVar101 < uVar60);
                      iVar72 = iVar72 + 1;
                    }
                    iVar67 = (0x11 - (uint)(uVar61 < 10000000000000000)) -
                             (uint)(uVar61 < 1000000000000000);
                    local_38 = puVar1;
                    if (iVar67 + iVar72 + 5U < 0x1b) {
                      uVar66 = iVar67 + iVar72;
                      if ((int)uVar66 < 1) {
                        uVar60 = uVar61 / 100000000;
                        uVar100 = (uint)uVar60;
                        puVar89 = (undefined2 *)
                                  ((long)puVar1 +
                                  (((ulong)(2 - uVar66) + 1) - (ulong)(uVar100 < 100000000)));
                        iVar91 = (int)((uVar60 & 0xffffffff) / 10000);
                        iVar67 = iVar91 * -10000 + uVar100;
                        uVar61 = uVar60 * 0xfa0a1f00 + uVar61;
                        iVar72 = (int)(((uVar60 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar72 * 0x29) >> 0xc;
                        uVar92 = uVar96 * -100 + iVar72;
                        uVar86 = iVar72 * -100 + iVar91;
                        *(char *)((long)puVar1 + (ulong)(2 - uVar66)) = (char)uVar96 + '0';
                        uVar60 = (ulong)(uVar92 < 10 && uVar100 < 100000000);
                        *puVar89 = *(undefined2 *)(digit_table + uVar60 + uVar92 * 2);
                        *(undefined2 *)((long)puVar89 + (2 - uVar60)) =
                             *(undefined2 *)(digit_table + uVar86 * 2);
                        iVar72 = (int)uVar61;
                        if (iVar72 == 0) {
                          if (iVar67 == 0) {
                            uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar86 != 0) {
                              uVar61 = 0;
                            }
                            uVar61 = uVar61 + (byte)dec_trailing_zero_table[uVar86];
                            lVar69 = 4;
                          }
                          else {
                            uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                            uVar86 = uVar100 * -100 + iVar67;
                            *(undefined2 *)((long)puVar89 + (4 - uVar60)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                            *(undefined2 *)((long)puVar89 + (6 - uVar60)) =
                                 *(undefined2 *)(digit_table + uVar86 * 2);
                            uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar100] + 2;
                            if (uVar86 != 0) {
                              uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar86];
                            }
                            lVar69 = 8;
                          }
                          uVar61 = lVar69 - uVar61;
                        }
                        else {
                          uVar92 = (uint)(iVar67 * 0x147b) >> 0x13;
                          uVar100 = (uint)((uVar61 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar100 >> 8;
                          uVar86 = uVar96 * 0x147b >> 0x13;
                          uVar61 = (ulong)uVar86;
                          uVar100 = uVar86 * -100 + (uVar100 >> 8);
                          *(undefined2 *)((long)puVar89 + (4 - uVar60)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar89 + (6 - uVar60)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar67) * 2);
                          *(undefined2 *)((long)puVar89 + (8 - uVar60)) =
                               *(undefined2 *)(digit_table + uVar61 * 2);
                          *(undefined2 *)((long)puVar89 + (10 - uVar60)) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          iVar72 = uVar96 * -10000 + iVar72;
                          if (iVar72 == 0) {
                            lVar69 = 0xc;
                          }
                          else {
                            uVar100 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar61 = (ulong)uVar100;
                            uVar100 = uVar100 * -100 + iVar72;
                            *(undefined2 *)((long)puVar89 + (0xc - uVar60)) =
                                 *(undefined2 *)(digit_table + uVar61 * 2);
                            *(undefined2 *)((long)puVar89 + (0xe - uVar60)) =
                                 *(undefined2 *)(digit_table + uVar100 * 2);
                            lVar69 = 0x10;
                          }
                          uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar61] + 2;
                          if (uVar100 != 0) {
                            uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar100];
                          }
                          uVar61 = lVar69 - uVar61;
                        }
                        puVar77 = (uint *)((long)puVar89 + ((uVar61 & 0xffffffff) - uVar60));
                        *(undefined2 *)puVar1 = 0x2e30;
                        if ((int)uVar66 < 0) {
                          uVar100 = -uVar66;
                          if ((int)-uVar66 < 2) {
                            uVar100 = 1;
                          }
                          switchD_0105b559::default
                                    ((undefined2 *)((long)puVar1 + 2),0x30,(ulong)uVar100);
                        }
                      }
                      else {
                        uVar60 = uVar61 / 100000000;
                        uVar100 = (uint)uVar60;
                        puVar89 = (undefined2 *)((long)puVar1 + (2 - (ulong)(uVar100 < 100000000)));
                        iVar91 = (int)((uVar60 & 0xffffffff) / 10000);
                        iVar67 = iVar91 * -10000 + uVar100;
                        uVar61 = uVar60 * 0xfa0a1f00 + uVar61;
                        iVar72 = (int)(((uVar60 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar72 * 0x29) >> 0xc;
                        uVar92 = uVar96 * -100 + iVar72;
                        uVar86 = iVar72 * -100 + iVar91;
                        *puVar1 = 0x30303030;
                        puVar1[1] = 0x30303030;
                        puVar1[2] = 0x30303030;
                        puVar1[3] = 0x30303030;
                        *(undefined8 *)(puVar1 + 4) = 0x3030303030303030;
                        *(char *)((long)puVar1 + 1) = (char)uVar96 + '0';
                        uVar60 = (ulong)(uVar92 < 10 && uVar100 < 100000000);
                        *puVar89 = *(undefined2 *)(digit_table + uVar60 + uVar92 * 2);
                        *(undefined2 *)((long)puVar89 + (2 - uVar60)) =
                             *(undefined2 *)(digit_table + uVar86 * 2);
                        iVar72 = (int)uVar61;
                        if (iVar72 == 0) {
                          if (iVar67 == 0) {
                            uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar86 != 0) {
                              uVar61 = 0;
                            }
                            uVar61 = uVar61 + (byte)dec_trailing_zero_table[uVar86];
                            lVar62 = 4;
                          }
                          else {
                            uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                            uVar86 = uVar100 * -100 + iVar67;
                            *(undefined2 *)((long)puVar89 + (4 - uVar60)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                            *(undefined2 *)((long)puVar89 + (6 - uVar60)) =
                                 *(undefined2 *)(digit_table + uVar86 * 2);
                            uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar100] + 2;
                            if (uVar86 != 0) {
                              uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar86];
                            }
                            lVar62 = 8;
                          }
                          uVar61 = lVar62 - uVar61;
                        }
                        else {
                          uVar92 = (uint)(iVar67 * 0x147b) >> 0x13;
                          uVar100 = (uint)((uVar61 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar100 >> 8;
                          uVar86 = uVar96 * 0x147b >> 0x13;
                          uVar61 = (ulong)uVar86;
                          uVar100 = uVar86 * -100 + (uVar100 >> 8);
                          *(undefined2 *)((long)puVar89 + (4 - uVar60)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar89 + (6 - uVar60)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar67) * 2);
                          *(undefined2 *)((long)puVar89 + (8 - uVar60)) =
                               *(undefined2 *)(digit_table + uVar61 * 2);
                          *(undefined2 *)((long)puVar89 + (10 - uVar60)) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          iVar72 = uVar96 * -10000 + iVar72;
                          if (iVar72 == 0) {
                            lVar62 = 0xc;
                          }
                          else {
                            uVar100 = (uint)(iVar72 * 0x147b) >> 0x13;
                            uVar61 = (ulong)uVar100;
                            uVar100 = uVar100 * -100 + iVar72;
                            *(undefined2 *)((long)puVar89 + (0xc - uVar60)) =
                                 *(undefined2 *)(digit_table + uVar61 * 2);
                            *(undefined2 *)((long)puVar89 + (0xe - uVar60)) =
                                 *(undefined2 *)(digit_table + uVar100 * 2);
                            lVar62 = 0x10;
                          }
                          uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar61] + 2;
                          if (uVar100 != 0) {
                            uVar61 = (ulong)(byte)dec_trailing_zero_table[uVar100];
                          }
                          uVar61 = lVar62 - uVar61;
                        }
                        puVar106 = (uint *)((long)puVar89 + ((uVar61 & 0xffffffff) - uVar60));
                        uVar61 = 1;
                        if (1 < (int)uVar66) {
                          uVar61 = (ulong)uVar66;
                        }
                        uVar60 = 0;
                        do {
                          *(byte *)((long)puVar77 + uVar60 + lVar69) =
                               *(byte *)((long)puVar77 + uVar60 + lVar69 + 1);
                          uVar60 = uVar60 + 1;
                        } while (uVar61 != uVar60);
                        puVar77 = (uint *)((undefined1 *)((ulong)uVar66 + (long)puVar1) + 2);
                        *(undefined1 *)((ulong)uVar66 + (long)puVar1) = 0x2e;
                        if (puVar77 < puVar106) {
                          puVar77 = puVar106;
                        }
                      }
                    }
                    else {
                      uVar60 = uVar61 / 100000000;
                      uVar66 = (uint)uVar60;
                      lVar69 = 2 - (ulong)(uVar66 < 100000000);
                      iVar87 = (int)((uVar60 & 0xffffffff) / 10000);
                      iVar85 = iVar87 * -10000 + uVar66;
                      uVar61 = uVar60 * 0xfa0a1f00 + uVar61;
                      iVar91 = (int)(((uVar60 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar100 = (uint)(iVar91 * 0x29) >> 0xc;
                      uVar92 = uVar100 * -100 + iVar91;
                      uVar86 = iVar91 * -100 + iVar87;
                      *(char *)((long)puVar1 + 1) = (char)uVar100 + '0';
                      uVar60 = (ulong)(uVar92 < 10 && uVar66 < 100000000);
                      *(undefined2 *)((long)puVar1 + lVar69) =
                           *(undefined2 *)(digit_table + uVar60 + uVar92 * 2);
                      lVar69 = lVar69 - uVar60;
                      *(undefined2 *)((long)puVar1 + lVar69 + 2) =
                           *(undefined2 *)(digit_table + uVar86 * 2);
                      iVar91 = (int)uVar61;
                      if (iVar91 == 0) {
                        if (iVar85 == 0) {
                          uVar66 = (uint)(byte)dec_trailing_zero_table[uVar92];
                          if (uVar86 != 0) {
                            uVar66 = 0;
                          }
                          uVar66 = uVar66 + (byte)dec_trailing_zero_table[uVar86];
                          iVar91 = 4;
                        }
                        else {
                          uVar66 = (uint)(iVar85 * 0x147b) >> 0x13;
                          uVar100 = uVar66 * -100 + iVar85;
                          *(undefined2 *)((long)puVar1 + lVar69 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + lVar69 + 6) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          uVar66 = (byte)dec_trailing_zero_table[uVar66] + 2;
                          if (uVar100 != 0) {
                            uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                          }
                          iVar91 = 8;
                        }
                        uVar66 = iVar91 - uVar66;
                      }
                      else {
                        uVar92 = (uint)(iVar85 * 0x147b) >> 0x13;
                        uVar66 = (uint)((uVar61 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar96 = uVar66 >> 8;
                        uVar86 = uVar96 * 0x147b >> 0x13;
                        uVar100 = uVar86 * -100 + (uVar66 >> 8);
                        *(undefined2 *)((long)puVar1 + lVar69 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                        *(undefined2 *)((long)puVar1 + lVar69 + 6) =
                             *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar85) * 2);
                        *(undefined2 *)((long)puVar1 + lVar69 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                        *(undefined2 *)((long)puVar1 + lVar69 + 10) =
                             *(undefined2 *)(digit_table + uVar100 * 2);
                        iVar91 = uVar96 * -10000 + iVar91;
                        if (iVar91 == 0) {
                          uVar66 = (byte)dec_trailing_zero_table[uVar86] + 2;
                          if (uVar100 != 0) {
                            uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                          }
                          iVar91 = 0xc;
                        }
                        else {
                          uVar66 = (uint)(iVar91 * 0x147b) >> 0x13;
                          uVar100 = uVar66 * -100 + iVar91;
                          *(undefined2 *)((long)puVar1 + lVar69 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                          *(undefined2 *)((long)puVar1 + lVar69 + 0xe) =
                               *(undefined2 *)(digit_table + uVar100 * 2);
                          uVar66 = (byte)dec_trailing_zero_table[uVar66] + 2;
                          if (uVar100 != 0) {
                            uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                          }
                          iVar91 = 0x10;
                        }
                        uVar66 = iVar91 - uVar66;
                      }
                      puVar89 = (undefined2 *)
                                ((long)puVar1 +
                                (((ulong)uVar66 + lVar69) - (ulong)((ulong)uVar66 + lVar69 == 2)));
                      uVar100 = (iVar67 + iVar72) - 1;
                      *(undefined1 *)puVar1 = *(undefined1 *)((long)puVar1 + 1);
                      *(undefined1 *)((long)puVar1 + 1) = 0x2e;
                      *puVar89 = 0x2d65;
                      uVar86 = uVar100 >> 0x1f;
                      pcVar65 = (char *)((long)puVar89 + (ulong)uVar86 + 1);
                      uVar66 = -uVar100;
                      if (0 < (int)uVar100) {
                        uVar66 = uVar100;
                      }
                      if (uVar66 < 100) {
                        *(undefined2 *)pcVar65 =
                             *(undefined2 *)(digit_table + (ulong)(uVar66 < 10) + (ulong)uVar66 * 2)
                        ;
                        puVar77 = (uint *)(pcVar65 + (2 - (ulong)(uVar66 < 10)));
                      }
                      else {
                        *pcVar65 = (char)(uVar66 * 0x290 >> 0x10) + '0';
                        *(undefined2 *)((long)puVar89 + (ulong)uVar86 + 2) =
                             *(undefined2 *)
                              (digit_table + ((uVar66 * 0x290 >> 0x10) * 0x7fffff9c + uVar66) * 2);
                        puVar77 = (uint *)((long)puVar89 + (ulong)uVar86 + 4);
                      }
                    }
                  }
                }
              }
LAB_01d4c9b5:
              if (puVar77 != (uint *)0x0) {
                *(ushort *)puVar77 = 0xa2c;
                puVar77 = (uint *)((long)puVar77 + 2);
                goto LAB_01d4c9d0;
              }
LAB_01d4f928:
              if (dat_len != (usize *)0x0) {
                *dat_len = 0;
              }
              pyVar70 = &local_50;
              if (err != (yyjson_write_err *)0x0) {
                pyVar70 = err;
              }
              pyVar58->code = 4;
              pcVar65 = "nan or inf number is not allowed";
              goto LAB_01d4f8a7;
            }
            if (((uint)uVar61 & 7) == 5) {
              uVar101 = uVar61 >> 8;
              puVar106 = (uint *)(pyVar93->uni).str;
              uVar60 = uVar63;
              if ((uVar100 & uVar66) != 0) {
                uVar60 = 0x10;
              }
              uVar60 = uVar60 + uVar101 * 6;
              if (puVar79 <= (ulong *)(uVar60 + (long)puVar77)) {
                uVar83 = local_e0 >> 1;
                if (local_e0 >> 1 <= uVar60) {
                  uVar83 = uVar60;
                }
                sVar104 = (uVar83 + 7 & 0xfffffffffffffff8) + local_e0;
                pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
                if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                puVar59 = (ulong *)(pbVar82 + (sVar104 - ((long)local_90 - (long)puVar79)));
                memmove(puVar59,pbVar82 + ((long)puVar79 - (long)local_e8),
                        (long)local_90 - (long)puVar79);
                puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
                local_90 = (ulong *)(pbVar82 + sVar104);
                local_e8 = pbVar82;
                local_e0 = sVar104;
              }
              lVar69 = lVar97;
              if (lVar97 != 0 && (uVar100 & uVar66) == 0) {
                do {
                  puVar102 = (uint *)(lVar107 + (long)puVar77);
                  *puVar77 = 0x20202020;
                  lVar69 = lVar69 + -1;
                  puVar77 = puVar102;
                } while (lVar69 != 0);
              }
              if ((puVar75 != enc_table_cpy) || ((pyVar93->tag & 0x18) == 0)) {
                puVar102 = (uint *)(uVar101 + (long)puVar106);
                *(byte *)puVar77 = 0x22;
LAB_01d4b202:
                lVar69 = (long)puVar102 - (long)puVar106;
                if (0xf < lVar69) {
                  lVar62 = 0;
                  do {
                    puVar78 = (uint *)((long)puVar77 + lVar62 + 1);
                    puVar88 = (uint *)((long)puVar106 + lVar62);
                    if (puVar75[*(byte *)((long)puVar106 + lVar62)] != '\0') goto LAB_01d4b610;
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 1)] != '\0') {
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 1);
                      puVar88 = (uint *)((long)puVar106 + lVar62);
                      goto LAB_01d4b3ee;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 2)] != '\0') {
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 1);
                      puVar88 = (uint *)((long)puVar106 + lVar62);
                      goto LAB_01d4b410;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 3)] != '\0') {
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 1);
                      puVar88 = (uint *)((long)puVar106 + lVar62);
                      goto LAB_01d4b436;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 4)] != '\0') {
                      puVar88 = (uint *)((byte *)((long)puVar106 + lVar62) + 4);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 5);
                      *(undefined4 *)((long)puVar77 + lVar62 + 1) =
                           *(undefined4 *)((long)puVar106 + lVar62);
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 5)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 5);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 6);
                      *(byte *)((long)puVar78 + -1) = pbVar82[4];
                      *(undefined4 *)((long)puVar78 + -5) = *(undefined4 *)pbVar82;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 6)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 6);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 7);
                      *(ushort *)((long)puVar78 + -2) = *(ushort *)(pbVar82 + 4);
                      *(undefined4 *)((long)puVar78 + -6) = *(undefined4 *)pbVar82;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 7)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 7);
                      uVar4 = *(undefined4 *)pbVar82;
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 8);
                      *(undefined4 *)((long)puVar77 + lVar62 + 4) = *(undefined4 *)(pbVar82 + 3);
                      *(undefined4 *)((long)puVar77 + lVar62 + 1) = uVar4;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 8)] != '\0') {
                      puVar88 = (uint *)((byte *)((long)puVar106 + lVar62) + 8);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 9);
                      *(undefined8 *)((long)puVar77 + lVar62 + 1) =
                           *(undefined8 *)((long)puVar106 + lVar62);
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 9)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 9);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 10);
                      *(byte *)((long)puVar78 + -1) = pbVar82[8];
                      *(undefined8 *)((long)puVar78 + -9) = *(undefined8 *)pbVar82;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 10)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 10);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 0xb);
                      *(ushort *)((long)puVar78 + -2) = *(ushort *)(pbVar82 + 8);
                      *(undefined8 *)((long)puVar78 + -10) = *(undefined8 *)pbVar82;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 0xb)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 0xb);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 0xc);
                      puVar78[-1] = *(uint *)(pbVar82 + 7);
                      *(undefined8 *)((long)puVar78 + -0xb) = *(undefined8 *)pbVar82;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 0xc)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 0xc);
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 0xd);
                      puVar78[-1] = *(uint *)(pbVar82 + 8);
                      *(undefined8 *)(puVar78 + -3) = *(undefined8 *)pbVar82;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 0xd)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 0xd);
                      uVar73 = *(undefined8 *)pbVar82;
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 0xe);
                      *(undefined8 *)((long)puVar77 + lVar62 + 6) = *(undefined8 *)(pbVar82 + 5);
                      *(undefined8 *)((long)puVar77 + lVar62 + 1) = uVar73;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 0xe)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 0xe);
                      uVar73 = *(undefined8 *)pbVar82;
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 0xf);
                      *(undefined8 *)((long)puVar77 + lVar62 + 7) = *(undefined8 *)(pbVar82 + 6);
                      *(undefined8 *)((long)puVar77 + lVar62 + 1) = uVar73;
                      goto LAB_01d4b610;
                    }
                    if (puVar75[*(byte *)((long)puVar106 + lVar62 + 0xf)] != '\0') {
                      pbVar82 = (byte *)((long)puVar106 + lVar62);
                      puVar88 = (uint *)(pbVar82 + 0xf);
                      uVar73 = *(undefined8 *)pbVar82;
                      puVar78 = (uint *)((long)puVar77 + lVar62 + 0x10);
                      *(undefined8 *)((long)puVar77 + lVar62 + 8) = *(undefined8 *)(pbVar82 + 7);
                      *(undefined8 *)((long)puVar77 + lVar62 + 1) = uVar73;
                      goto LAB_01d4b610;
                    }
                    uVar86 = puVar88[1];
                    uVar92 = puVar88[2];
                    uVar96 = puVar88[3];
                    *puVar78 = *puVar88;
                    *(uint *)((long)puVar77 + lVar62 + 5) = uVar86;
                    *(uint *)((long)puVar77 + lVar62 + 9) = uVar92;
                    *(uint *)((long)puVar77 + lVar62 + 0xd) = uVar96;
                    lVar62 = lVar62 + 0x10;
                    lVar69 = lVar69 + -0x10;
                  } while (0xf < lVar69);
                  puVar77 = (uint *)((long)puVar77 + lVar62);
                  puVar106 = (uint *)((long)puVar106 + lVar62);
                }
                puVar78 = (uint *)((long)puVar77 + 1);
                puVar88 = puVar106;
                for (lVar69 = (long)puVar102 - (long)puVar106; 3 < lVar69; lVar69 = lVar69 + -4) {
                  if (puVar75[(byte)*puVar88] != '\0') goto LAB_01d4b610;
                  if (puVar75[*(byte *)((long)puVar88 + 1)] != '\0') goto LAB_01d4b3ee;
                  if (puVar75[*(byte *)((long)puVar88 + 2)] != '\0') goto LAB_01d4b410;
                  if (puVar75[*(byte *)((long)puVar88 + 3)] != '\0') goto LAB_01d4b436;
                  *puVar78 = *puVar88;
                  puVar78 = puVar78 + 1;
                  puVar88 = puVar88 + 1;
                }
                while( true ) {
                  if (puVar102 <= puVar88) goto switchD_01d4b639_default;
                  uVar86 = *puVar88;
                  if (puVar75[(byte)uVar86] != '\0') break;
                  puVar88 = (uint *)((long)puVar88 + 1);
                  *(byte *)puVar78 = (byte)uVar86;
                  puVar78 = (uint *)((long)puVar78 + 1);
                }
                goto LAB_01d4b610;
              }
              *(byte *)puVar77 = 0x22;
              puVar77 = (uint *)((long)puVar77 + 1);
              if (0xfff < uVar61) {
                do {
                  uVar86 = puVar106[1];
                  uVar92 = puVar106[2];
                  uVar96 = puVar106[3];
                  *puVar77 = *puVar106;
                  puVar77[1] = uVar86;
                  puVar77[2] = uVar92;
                  puVar77[3] = uVar96;
                  puVar77 = puVar77 + 4;
                  puVar106 = puVar106 + 4;
                  uVar101 = uVar101 - 0x10;
                } while (0xf < uVar101);
              }
              for (; 3 < uVar101; uVar101 = uVar101 - 4) {
                *puVar77 = *puVar106;
                puVar77 = puVar77 + 1;
                puVar106 = puVar106 + 1;
              }
              if (uVar101 != 0) {
                uVar61 = 0;
                do {
                  *(byte *)((long)puVar77 + uVar61) = *(byte *)((long)puVar106 + uVar61);
                  uVar61 = uVar61 + 1;
                } while (uVar101 != uVar61);
                puVar77 = (uint *)((long)puVar77 + uVar61);
              }
              *(byte *)puVar77 = 0x22;
              pbVar82 = (byte *)((long)puVar77 + 1);
              goto LAB_01d4c8b5;
            }
            if ((~(byte)(uVar61 & 0xffffffff) & 6) != 0) {
              if (bVar105 == 1) {
                uVar61 = uVar61 >> 8;
                pvVar9 = (pyVar93->uni).ptr;
                if (puVar79 <= (ulong *)(uVar61 + 3 + (long)puVar77)) {
                  uVar60 = local_e0 >> 1;
                  if (local_e0 >> 1 <= uVar61 + 3) {
                    uVar60 = uVar61 + 3;
                  }
                  sVar104 = (uVar60 + 7 & 0xfffffffffffffff8) + local_e0;
                  pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
                  if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                  sVar74 = (long)local_90 - (long)puVar79;
                  memmove(pbVar82 + (sVar104 - sVar74),pbVar82 + ((long)puVar79 - (long)local_e8),
                          sVar74);
                  puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
                  local_90 = (ulong *)(pbVar82 + sVar104);
                  puVar59 = (ulong *)(pbVar82 + (sVar104 - sVar74));
                  local_e8 = pbVar82;
                  local_e0 = sVar104;
                }
                switchD_015ff80e::default(puVar77,pvVar9,uVar61);
                pbVar82 = (byte *)((long)puVar77 + uVar61);
                puVar77 = (uint *)(pbVar82 + 2);
                pbVar82[0] = 0x2c;
                pbVar82[1] = 10;
              }
              else if (bVar105 == 2) {
                uVar61 = uVar63;
                if ((uVar100 & uVar66) != 0) {
                  uVar61 = 0x10;
                }
                if (puVar79 <= (ulong *)(uVar61 + (long)puVar77)) {
                  uVar60 = local_e0 >> 1;
                  if (local_e0 >> 1 <= uVar61) {
                    uVar60 = uVar61;
                  }
                  sVar104 = (uVar60 + 7 & 0xfffffffffffffff8) + local_e0;
                  pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
                  if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                  puVar59 = (ulong *)(pbVar82 + (sVar104 - ((long)local_90 - (long)puVar79)));
                  memmove(puVar59,pbVar82 + ((long)puVar79 - (long)local_e8),
                          (long)local_90 - (long)puVar79);
                  puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
                  local_90 = (ulong *)(pbVar82 + sVar104);
                  local_e8 = pbVar82;
                  local_e0 = sVar104;
                }
                lVar69 = lVar97;
                puVar106 = puVar77;
                if (lVar97 != 0 && (uVar100 & uVar66) == 0) {
                  do {
                    puVar77 = (uint *)(lVar107 + (long)puVar106);
                    *puVar106 = 0x20202020;
                    lVar69 = lVar69 + -1;
                    puVar106 = puVar77;
                  } while (lVar69 != 0);
                }
                puVar77[0] = 0x6c6c756e;
                puVar77[1] = 0xa2c;
                puVar77 = (uint *)((long)puVar77 + 6);
              }
              else {
                if (bVar105 != 3) goto LAB_01d4f86d;
                uVar61 = uVar63;
                if ((uVar100 & uVar66) != 0) {
                  uVar61 = 0x10;
                }
                if (puVar79 <= (ulong *)(uVar61 + (long)puVar77)) {
                  uVar60 = local_e0 >> 1;
                  if (local_e0 >> 1 <= uVar61) {
                    uVar60 = uVar61;
                  }
                  sVar104 = (uVar60 + 7 & 0xfffffffffffffff8) + local_e0;
                  pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
                  if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                  puVar59 = (ulong *)(pbVar82 + (sVar104 - ((long)local_90 - (long)puVar79)));
                  memmove(puVar59,pbVar82 + ((long)puVar79 - (long)local_e8),
                          (long)local_90 - (long)puVar79);
                  puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
                  local_90 = (ulong *)(pbVar82 + sVar104);
                  local_e8 = pbVar82;
                  local_e0 = sVar104;
                }
                lVar69 = lVar97;
                puVar106 = puVar77;
                if (lVar97 != 0 && (uVar100 & uVar66) == 0) {
                  do {
                    puVar77 = (uint *)(lVar107 + (long)puVar106);
                    *puVar106 = 0x20202020;
                    lVar69 = lVar69 + -1;
                    puVar106 = puVar77;
                  } while (lVar69 != 0);
                }
                bVar109 = (pyVar93->tag & 0x18) != 0;
                uVar73 = 0xa2c65736c6166;
                if (bVar109) {
                  uVar73 = 0xa2c65757274;
                }
                *(undefined8 *)puVar77 = uVar73;
                puVar77 = (uint *)((long)puVar77 + (7 - (ulong)bVar109));
              }
              goto LAB_01d4c9d0;
            }
            uVar100 = uVar100 & uVar66;
            if (uVar61 < 0x100) {
              uVar61 = uVar63;
              if (uVar100 != 0) {
                uVar61 = 0x10;
              }
              if (puVar79 <= (ulong *)(uVar61 + (long)puVar77)) {
                uVar60 = local_e0 >> 1;
                if (local_e0 >> 1 <= uVar61) {
                  uVar60 = uVar61;
                }
                sVar104 = (uVar60 + 7 & 0xfffffffffffffff8) + local_e0;
                pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
                if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
                puVar59 = (ulong *)(pbVar82 + (sVar104 - ((long)local_90 - (long)puVar79)));
                memmove(puVar59,pbVar82 + ((long)puVar79 - (long)local_e8),
                        (long)local_90 - (long)puVar79);
                puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
                local_90 = (ulong *)(pbVar82 + sVar104);
                local_e8 = pbVar82;
                local_e0 = sVar104;
              }
              lVar69 = lVar97;
              puVar106 = puVar77;
              if (lVar97 != 0 && uVar100 == 0) {
                do {
                  puVar77 = (uint *)(lVar107 + (long)puVar106);
                  *puVar106 = 0x20202020;
                  lVar69 = lVar69 + -1;
                  puVar106 = puVar77;
                } while (lVar69 != 0);
              }
              bVar105 = (bVar105 == 7) * ' ';
              *(byte *)puVar77 = bVar105 + 0x5b;
              *(byte *)((long)puVar77 + 1) = bVar105 | 0x5d;
              *(ushort *)((long)puVar77 + 2) = 0xa2c;
              puVar77 = puVar77 + 1;
              goto LAB_01d4c9d0;
            }
            local_40 = CONCAT71((int7)((uVar61 & 0xffffffff) >> 8),bVar105 == 7);
            if (uVar100 != 0) {
              uVar84 = 0x20;
            }
            if (puVar79 <= (ulong *)(uVar84 + (long)puVar77)) {
              uVar63 = local_e0 >> 1;
              if (local_e0 >> 1 <= uVar84) {
                uVar63 = uVar84;
              }
              sVar104 = (uVar63 + 7 & 0xfffffffffffffff8) + local_e0;
              pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
              if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
              sVar74 = (long)local_90 - (long)puVar79;
              memmove(pbVar82 + (sVar104 - sVar74),pbVar82 + ((long)puVar79 - (long)local_e8),sVar74
                     );
              puVar77 = (uint *)(pbVar82 + ((long)puVar77 - (long)local_e8));
              local_90 = (ulong *)(pbVar82 + sVar104);
              local_e0 = sVar104;
              puVar79 = (ulong *)(pbVar82 + (sVar104 - sVar74));
              local_e8 = pbVar82;
            }
            lVar69 = lVar90 * 2;
            lVar90 = (uVar61 >> 8) << (bVar105 == 7);
            puVar79[-1] = uVar80 + lVar69;
            lVar69 = lVar97;
            puVar106 = puVar77;
            if (lVar97 != 0 && uVar100 == 0) {
              do {
                puVar77 = (uint *)(lVar107 + (long)puVar106);
                *puVar106 = 0x20202020;
                lVar69 = lVar69 + -1;
                puVar106 = puVar77;
              } while (lVar69 != 0);
            }
            puVar59 = puVar79 + -1;
            lVar97 = lVar97 + 1;
            *(byte *)puVar77 = (bVar105 == 7) << 5 | 0x5b;
            *(byte *)((long)puVar77 + 1) = 10;
            puVar77 = (uint *)((long)puVar77 + 2);
            pyVar93 = pyVar93 + 1;
          } while( true );
        }
      }
      local_e8 = (byte *)0x0;
LAB_01d4f8d1:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar70 = &local_50;
      if (err != (yyjson_write_err *)0x0) {
        pyVar70 = err;
      }
      pyVar58->code = 2;
      pyVar70->msg = "memory allocation failed";
      if (local_e8 != (byte *)0x0) {
        (*p_Var6)(pvVar7,local_e8);
      }
      goto LAB_01d4fca7;
    }
    if ((flg & 2) != 0) {
      puVar99 = enc_table_esc_slash;
      if ((flg & 4) == 0) {
        puVar99 = enc_table_esc;
      }
      switch(bVar105 & 7) {
      case 1:
        goto switchD_01d4abf4_caseD_1;
      case 2:
        goto switchD_01d4abf4_caseD_2;
      case 3:
        goto switchD_01d4abf4_caseD_3;
      case 4:
        goto switchD_01d4abf4_caseD_4;
      case 5:
        goto switchD_01d4abf4_caseD_5;
      case 6:
        goto switchD_01d4abf4_caseD_6;
      case 7:
        goto switchD_01d4abf4_caseD_7;
      }
switchD_01d4abf4_caseD_0:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar70 = &local_50;
      if (err != (yyjson_write_err *)0x0) {
        pyVar70 = err;
      }
      pyVar58->code = 3;
      pyVar70->msg = "invalid JSON value type";
      goto LAB_01d4fca7;
    }
    puVar99 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar99 = enc_table_cpy;
    }
    switch(bVar105 & 7) {
    case 0:
      goto switchD_01d4abf4_caseD_0;
    case 1:
switchD_01d4abf4_caseD_1:
      uVar84 = uVar84 >> 8;
      pvVar9 = (val->uni).ptr;
      puVar77 = (uint *)(*p_Var5)(pvVar7,uVar84 + 2);
      if (puVar77 == (uint *)0x0) break;
      switchD_015ff80e::default(puVar77,pvVar9,uVar84);
      local_78 = (uint *)((long)puVar77 + uVar84);
      goto LAB_01d4fc3c;
    case 2:
switchD_01d4abf4_caseD_2:
      puVar77 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar77 != (uint *)0x0) {
        puVar77[0] = 0x6c6c756e;
        puVar77[1] = 0xa2c;
        local_78 = puVar77 + 1;
        goto LAB_01d4fc3c;
      }
      break;
    case 3:
switchD_01d4abf4_caseD_3:
      puVar77 = (uint *)(*p_Var5)(pvVar7,8);
      if (puVar77 != (uint *)0x0) {
        bVar109 = (val->tag & 0x18) != 0;
        uVar73 = 0xa2c65736c6166;
        if (bVar109) {
          uVar73 = 0xa2c65757274;
        }
        *(undefined8 *)puVar77 = uVar73;
        local_78 = (uint *)((long)puVar77 + (5 - (ulong)bVar109));
        goto LAB_01d4fc3c;
      }
      break;
    case 4:
switchD_01d4abf4_caseD_4:
      puVar77 = (uint *)(*p_Var5)(pvVar7,0x22);
      if (puVar77 == (uint *)0x0) break;
      pcVar65 = (char *)(val->uni).u64;
      uVar66 = (uint)((ulong)pcVar65 >> 0x20);
      if ((val->tag & 0x10) == 0) {
        uVar66 = uVar66 >> 0x1f & (uint)(val->tag >> 3);
        pcVar68 = (char *)-(long)pcVar65;
        if (uVar66 == 0) {
          pcVar68 = pcVar65;
        }
        *(byte *)puVar77 = 0x2d;
        pbVar82 = (byte *)((long)puVar77 + (ulong)uVar66);
        if (pcVar68 < (char *)0x5f5e100) {
          if (pcVar68 < (char *)0x64) {
            *(undefined2 *)pbVar82 =
                 *(undefined2 *)(digit_table + (ulong)(pcVar68 < (char *)0xa) + (long)pcVar68 * 2);
            pbVar82 = pbVar82 + -(ulong)(pcVar68 < (char *)0xa);
LAB_01d51759:
            local_78 = (uint *)(pbVar82 + 2);
          }
          else {
            iVar72 = (int)pcVar68;
            if (pcVar68 < (char *)0x2710) {
              uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar84 = (ulong)(pcVar68 < (char *)0x3e8);
              *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar66 * 2);
              *(undefined2 *)(pbVar82 + (2 - uVar84)) =
                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
              local_78 = (uint *)(pbVar82 + (4 - uVar84));
            }
            else {
              if ((char *)0xf423f < pcVar68) {
                uVar66 = (uint)((ulong)((long)pcVar68 * 0x68db8bb) >> 0x20);
                uVar100 = uVar66 >> 8;
                iVar72 = uVar100 * -10000 + iVar72;
                uVar100 = uVar100 * 0x147b >> 0x13;
                uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                iVar72 = uVar86 * -100 + iVar72;
                *(undefined2 *)pbVar82 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar68 < "stampNSERKS1_EEEE") + (ulong)uVar100 * 2);
                pbVar82 = pbVar82 + -(ulong)(pcVar68 < "stampNSERKS1_EEEE");
                *(undefined2 *)(pbVar82 + 2) =
                     *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                uVar71 = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                goto LAB_01d5135f;
              }
              iVar72 = (int)((ulong)((long)pcVar68 * 0x68db9) >> 0x20) * -10000 + iVar72;
              uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
              uVar84 = (ulong)(pcVar68 < (char *)0x186a0);
              *(undefined2 *)pbVar82 =
                   *(undefined2 *)
                    (digit_table + uVar84 + ((ulong)((long)pcVar68 * 0x68db9) >> 0x20) * 2);
              *(undefined2 *)(pbVar82 + (2 - uVar84)) =
                   *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
              *(undefined2 *)(pbVar82 + (4 - uVar84)) =
                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
              local_78 = (uint *)(pbVar82 + (6 - uVar84));
            }
          }
        }
        else {
          uVar84 = (ulong)pcVar68 / 100000000;
          pcVar65 = pcVar68 + uVar84 * 0xfa0a1f00;
          iVar72 = (int)uVar84;
          if (pcVar68 < (char *)0x2386f26fc10000) {
            if ("erERKSt9type_info" < (char *)((ulong)pcVar68 >> 10)) {
              if ((ulong)pcVar68 >> 0xc < 0xe8d4a51) {
                uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                uVar84 = (ulong)((ulong)pcVar68 >> 0xb < 0x2e90edd);
                *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar66 * 2);
                *(undefined2 *)(pbVar82 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                pbVar82 = pbVar82 + (4 - uVar84);
              }
              else if (pcVar68 < (char *)0x5af3107a4000) {
                iVar72 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar72;
                uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                uVar63 = (ulong)((ulong)pcVar68 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar82 =
                     *(undefined2 *)(digit_table + uVar63 + (uVar84 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                     *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                *(undefined2 *)(pbVar82 + (4 - uVar63)) =
                     *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                pbVar82 = pbVar82 + (6 - uVar63);
              }
              else {
                uVar66 = (uint)(uVar84 * 0x68db8bb >> 0x20);
                uVar100 = uVar66 >> 8;
                iVar72 = uVar100 * -10000 + iVar72;
                uVar100 = uVar100 * 0x147b >> 0x13;
                uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                uVar84 = (ulong)(pcVar68 < (char *)0x38d7ea4c68000);
                *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + uVar84 + (ulong)uVar100 * 2);
                *(undefined2 *)(pbVar82 + (2 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                *(undefined2 *)(pbVar82 + (4 - uVar84)) =
                     *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                *(undefined2 *)(pbVar82 + (6 - uVar84)) =
                     *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                pbVar82 = pbVar82 + (8 - uVar84);
              }
            }
            else {
              *(undefined2 *)pbVar82 =
                   *(undefined2 *)(digit_table + (ulong)(pcVar68 < (char *)0x3b9aca00) + uVar84 * 2)
              ;
              pbVar82 = pbVar82 + (2 - (ulong)(pcVar68 < (char *)0x3b9aca00));
            }
            uVar66 = (uint)(((ulong)pcVar65 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar100 = uVar66 >> 8;
            iVar72 = uVar100 * -10000 + (int)pcVar65;
            uVar100 = uVar100 * 0x147b >> 0x13;
            uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
            iVar72 = uVar86 * 0x7fffff9c + iVar72;
            *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
            *(undefined2 *)(pbVar82 + 2) =
                 *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
            uVar71 = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
LAB_01d5135f:
            *(undefined2 *)(pbVar82 + 4) = uVar71;
            *(undefined2 *)(pbVar82 + 6) = *(undefined2 *)(digit_table + (uint)(iVar72 * 2));
            local_78 = (uint *)(pbVar82 + 8);
          }
          else {
            uVar84 = (ulong)pcVar68 / 1000000000000;
            iVar67 = (int)uVar84;
            iVar72 = iVar72 + iVar67 * -10000;
            if (pcVar68 < (char *)0xde0b6b3a7640000) {
              iVar67 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar67;
              uVar66 = (uint)(iVar67 * 0x147b) >> 0x13;
              uVar63 = (ulong)(pcVar68 < (char *)0x16345785d8a0000);
              *(undefined2 *)pbVar82 =
                   *(undefined2 *)(digit_table + uVar63 + (uVar84 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                   *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
              *(undefined2 *)(pbVar82 + (4 - uVar63)) =
                   *(undefined2 *)(digit_table + (uVar66 * -100 + iVar67) * 2);
              lVar107 = 6 - uVar63;
            }
            else {
              uVar66 = (uint)(uVar84 / 10000);
              iVar67 = uVar66 * -10000 + iVar67;
              uVar66 = uVar66 / 100;
              uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
              uVar63 = (ulong)(pcVar68 < (char *)0x8ac7230489e80000);
              *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + uVar63 + (ulong)uVar66 * 2);
              *(undefined2 *)(pbVar82 + (2 - uVar63)) =
                   *(undefined2 *)(digit_table + (uVar66 * -100 + (int)(uVar84 / 10000)) * 2);
              *(undefined2 *)(pbVar82 + (4 - uVar63)) =
                   *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
              *(undefined2 *)(pbVar82 + (6 - uVar63)) =
                   *(undefined2 *)(digit_table + (uVar100 * -100 + iVar67) * 2);
              lVar107 = 8 - uVar63;
            }
            pbVar82 = pbVar82 + lVar107;
            uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
            *(undefined2 *)pbVar82 = *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
            *(undefined2 *)(pbVar82 + 2) =
                 *(undefined2 *)(digit_table + (uVar66 * 0x7fffff9c + iVar72) * 2);
            uVar66 = (uint)(((ulong)pcVar65 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar100 = uVar66 >> 8;
            iVar72 = uVar100 * -10000 + (int)pcVar65;
            uVar100 = uVar100 * 0x147b >> 0x13;
            uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
            *(undefined2 *)(pbVar82 + 4) = *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
            *(undefined2 *)(pbVar82 + 6) =
                 *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
            *(undefined2 *)(pbVar82 + 8) = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
            *(undefined2 *)(pbVar82 + 10) =
                 *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
            local_78 = (uint *)(pbVar82 + 0xc);
          }
        }
      }
      else {
        uVar84 = (ulong)pcVar65 & 0xfffffffffffff;
        uVar66 = uVar66 >> 0x14 & 0x7ff;
        if (uVar66 == 0x7ff) {
          if ((flg & 0x10) == 0) {
            if ((flg & 8) == 0) {
              local_78 = (uint *)0x0;
            }
            else if (uVar84 == 0) {
              *(byte *)puVar77 = 0x2d;
              lVar107 = -((long)pcVar65 >> 0x3f);
              *(undefined8 *)((long)puVar77 + lVar107) = 0x7974696e69666e49;
              local_78 = (uint *)((long)puVar77 + lVar107 + 8);
            }
            else {
              *puVar77 = 0x4e614e;
              local_78 = (uint *)((long)puVar77 + 3);
            }
          }
          else {
            *puVar77 = 0x6c6c756e;
            local_78 = puVar77 + 1;
          }
        }
        else {
          *(byte *)puVar77 = 0x2d;
          lVar107 = -((long)pcVar65 >> 0x3f);
          puVar103 = (undefined8 *)((long)puVar77 + lVar107);
          if (((ulong)pcVar65 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar103 = 0x302e30;
            local_78 = (uint *)((long)puVar103 + 3);
          }
          else if (uVar66 == 0) {
            yyjson_val_write_opts();
          }
          else {
            uVar63 = uVar84 + 0x10000000000000;
            if (uVar66 - 0x3ff < 0x35) {
              lVar97 = 0;
              if (uVar63 != 0) {
                for (; (uVar63 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                }
              }
              if (0x433 - uVar66 <= (uint)lVar97) {
                pcVar65 = (char *)(uVar63 >> ((byte)(0x433 - uVar66) & 0x3f));
                iVar72 = (int)pcVar65;
                if (pcVar65 < (char *)0x5f5e100) {
                  if (pcVar65 < (char *)0x64) {
                    *(undefined2 *)puVar103 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar65 < (char *)0xa) + (long)pcVar65 * 2);
                    pbVar82 = (byte *)((long)puVar103 + (2 - (ulong)(pcVar65 < (char *)0xa)));
                  }
                  else if (pcVar65 < (char *)0x2710) {
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar84 = (ulong)(pcVar65 < (char *)0x3e8);
                    *(undefined2 *)puVar103 =
                         *(undefined2 *)(digit_table + uVar84 + (ulong)uVar66 * 2);
                    *(undefined2 *)((long)puVar103 + (2 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                    pbVar82 = (byte *)((long)puVar103 + (4 - uVar84));
                  }
                  else if (pcVar65 < (char *)0xf4240) {
                    iVar72 = (int)((ulong)((long)pcVar65 * 0x68db9) >> 0x20) * -10000 + iVar72;
                    uVar66 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar84 = (ulong)(pcVar65 < (char *)0x186a0);
                    *(undefined2 *)puVar103 =
                         *(undefined2 *)
                          (digit_table + uVar84 + ((ulong)((long)pcVar65 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)((long)puVar103 + (2 - uVar84)) =
                         *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                    *(undefined2 *)((long)puVar103 + (4 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar66 * -100 + iVar72) * 2);
                    pbVar82 = (byte *)((long)puVar103 + (6 - uVar84));
                  }
                  else {
                    uVar66 = (uint)((ulong)((long)pcVar65 * 0x68db8bb) >> 0x20);
                    uVar100 = uVar66 >> 8;
                    iVar72 = uVar100 * -10000 + iVar72;
                    uVar100 = uVar100 * 0x147b >> 0x13;
                    uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar84 = (ulong)(pcVar65 < "stampNSERKS1_EEEE");
                    *(undefined2 *)puVar103 =
                         *(undefined2 *)(digit_table + uVar84 + (ulong)uVar100 * 2);
                    *(undefined2 *)((long)puVar103 + (2 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar100 * -100 + (uVar66 >> 8)) * 2);
                    *(undefined2 *)((long)puVar103 + (4 - uVar84)) =
                         *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                    *(undefined2 *)((long)puVar103 + (6 - uVar84)) =
                         *(undefined2 *)(digit_table + (uVar86 * -100 + iVar72) * 2);
                    pbVar82 = (byte *)((long)puVar103 + (8 - uVar84));
                  }
                }
                else {
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = pcVar65;
                  uVar84 = SUB168(auVar30 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                  iVar67 = (int)uVar84;
                  uVar66 = iVar67 * -100000000 + iVar72;
                  if ("erERKSt9type_info" < (char *)((ulong)pcVar65 >> 10)) {
                    if ((ulong)pcVar65 >> 0xc < 0xe8d4a51) {
                      uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                      uVar84 = (ulong)((ulong)pcVar65 >> 0xb < 0x2e90edd);
                      *(undefined2 *)puVar103 =
                           *(undefined2 *)(digit_table + uVar84 + (ulong)uVar100 * 2);
                      *(undefined2 *)((long)puVar103 + (2 - uVar84)) =
                           *(undefined2 *)(digit_table + (uVar100 * -100 + iVar67) * 2);
                      puVar89 = (undefined2 *)((long)puVar103 + (4 - uVar84));
                    }
                    else if (pcVar65 < (char *)0x5af3107a4000) {
                      iVar67 = (int)(uVar84 * 0x68db9 >> 0x20) * -10000 + iVar67;
                      uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                      uVar63 = (ulong)((ulong)pcVar65 >> 0xd < 0x48c27395);
                      *(undefined2 *)puVar103 =
                           *(undefined2 *)(digit_table + uVar63 + (uVar84 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)((long)puVar103 + (2 - uVar63)) =
                           *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                      *(undefined2 *)((long)puVar103 + (4 - uVar63)) =
                           *(undefined2 *)(digit_table + (uVar100 * -100 + iVar67) * 2);
                      puVar89 = (undefined2 *)((long)puVar103 + (6 - uVar63));
                    }
                    else {
                      uVar100 = (uint)(uVar84 * 0x68db8bb >> 0x20);
                      uVar86 = uVar100 >> 8;
                      iVar67 = uVar86 * -10000 + iVar67;
                      uVar86 = uVar86 * 0x147b >> 0x13;
                      uVar92 = (uint)(iVar67 * 0x147b) >> 0x13;
                      uVar84 = (ulong)(pcVar65 < (char *)0x38d7ea4c68000);
                      *(undefined2 *)puVar103 =
                           *(undefined2 *)(digit_table + uVar84 + (ulong)uVar86 * 2);
                      *(undefined2 *)((long)puVar103 + (2 - uVar84)) =
                           *(undefined2 *)(digit_table + (uVar86 * -100 + (uVar100 >> 8)) * 2);
                      *(undefined2 *)((long)puVar103 + (4 - uVar84)) =
                           *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                      *(undefined2 *)((long)puVar103 + (6 - uVar84)) =
                           *(undefined2 *)(digit_table + (uVar92 * -100 + iVar67) * 2);
                      puVar89 = (undefined2 *)((long)puVar103 + (8 - uVar84));
                    }
                  }
                  else {
                    *(undefined2 *)puVar103 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar65 < (char *)0x3b9aca00) + uVar84 * 2);
                    puVar89 = (undefined2 *)
                              ((long)puVar103 + (2 - (ulong)(pcVar65 < (char *)0x3b9aca00)));
                  }
                  uVar100 = (uint)((ulong)uVar66 * 0x68db8bb >> 0x20);
                  uVar86 = uVar100 >> 8;
                  iVar72 = uVar86 * -10000 + uVar66;
                  uVar66 = uVar86 * 0x147b >> 0x13;
                  uVar86 = (uint)(iVar72 * 0x147b) >> 0x13;
                  *puVar89 = *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                  puVar89[1] = *(undefined2 *)(digit_table + (uVar66 * -100 + (uVar100 >> 8)) * 2);
                  puVar89[2] = *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                  puVar89[3] = *(undefined2 *)(digit_table + (uVar86 * 0x7fffff9c + iVar72) * 2);
                  pbVar82 = (byte *)(puVar89 + 4);
                }
                pbVar82[0] = 0x2e;
                pbVar82[1] = 0x30;
                goto LAB_01d51759;
              }
            }
            uVar80 = (ulong)((uint)pcVar65 & 1);
            iVar72 = uVar66 * 0x4d105 + -0x200a5;
            if (uVar66 == 1 || uVar84 != 0) {
              iVar72 = uVar66 * 0x4d105;
            }
            iVar72 = iVar72 + -0x1439b7ff >> 0x14;
            uVar61 = *(ulong *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2ae) * 8);
            uVar60 = *(long *)(pow10_sig_table + (ulong)(iVar72 * -2 + 0x2af) * 8) +
                     (ulong)(iVar72 - 1U < 0xffffffc8);
            bVar105 = ((char)((uint)(iVar72 * -0x3526b) >> 0x10) + (char)uVar66) - 0x32;
            uVar84 = (ulong)(uVar66 != 1 && uVar84 == 0) + uVar63 * 4 + -2 << (bVar105 & 0x3f);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar60;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar84;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = SUB168(auVar24 * auVar43,8);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar61;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar84;
            auVar55 = auVar25 * auVar44 + auVar55;
            uVar84 = uVar63 * 4 << (bVar105 & 0x3f);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar60;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar84;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = SUB168(auVar26 * auVar45,8);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar61;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar84;
            auVar56 = auVar27 * auVar46 + auVar56;
            uVar84 = auVar56._8_8_;
            uVar63 = uVar63 * 4 + 2 << (bVar105 & 0x3f);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar60;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar63;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = SUB168(auVar28 * auVar47,8);
            auVar29._8_8_ = 0;
            auVar29._0_8_ = uVar61;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar63;
            auVar57 = auVar29 * auVar48 + auVar57;
            uVar63 = ((ulong)((auVar55 & (undefined1  [16])0xfffffffffffffffe) !=
                             (undefined1  [16])0x0) | auVar55._8_8_) + uVar80;
            uVar80 = ((ulong)((auVar57 & (undefined1  [16])0xfffffffffffffffe) !=
                             (undefined1  [16])0x0) | auVar57._8_8_) - uVar80;
            if (uVar84 < 0x28) {
LAB_01d4fe87:
              uVar60 = (auVar56 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                       uVar84;
              uVar61 = uVar84 & 0xfffffffffffffffc;
              bVar109 = true;
              if (uVar60 <= uVar61 + 2) {
                bVar109 = (bool)((byte)(uVar84 >> 2) & 0x3f & uVar60 == uVar61 + 2);
              }
              bVar108 = uVar61 + 4 <= uVar80;
              if (uVar61 < uVar63 == bVar108) {
                bVar109 = bVar108;
              }
              uVar84 = (uVar84 >> 2) + (ulong)bVar109;
            }
            else {
              uVar60 = uVar84 / 0x28;
              uVar61 = uVar60 * 0x28 + 0x28;
              if (uVar60 * 0x28 < uVar63 != uVar61 <= uVar80) goto LAB_01d4fe87;
              uVar84 = (uVar60 + 1) - (ulong)(uVar80 < uVar61);
              iVar72 = iVar72 + 1;
            }
            iVar67 = (0x11 - (uint)(uVar84 < 10000000000000000)) - (uint)(uVar84 < 1000000000000000)
            ;
            if (iVar67 + iVar72 + 5U < 0x1b) {
              uVar66 = iVar67 + iVar72;
              if ((int)uVar66 < 1) {
                uVar63 = uVar84 / 100000000;
                uVar86 = (uint)uVar63;
                puVar89 = (undefined2 *)
                          ((long)puVar103 +
                          (((ulong)(2 - uVar66) + 1) - (ulong)(uVar86 < 100000000)));
                iVar91 = (int)((uVar63 & 0xffffffff) / 10000);
                iVar67 = iVar91 * -10000 + uVar86;
                uVar84 = uVar63 * 0xfa0a1f00 + uVar84;
                iVar72 = (int)(((uVar63 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar92 = (uint)(iVar72 * 0x29) >> 0xc;
                uVar96 = uVar92 * -100 + iVar72;
                uVar100 = iVar72 * -100 + iVar91;
                *(char *)((long)puVar103 + (ulong)(2 - uVar66)) = (char)uVar92 + '0';
                uVar63 = (ulong)(uVar96 < 10 && uVar86 < 100000000);
                *puVar89 = *(undefined2 *)(digit_table + uVar63 + uVar96 * 2);
                *(undefined2 *)((long)puVar89 + (2 - uVar63)) =
                     *(undefined2 *)(digit_table + uVar100 * 2);
                iVar72 = (int)uVar84;
                if (iVar72 == 0) {
                  if (iVar67 == 0) {
                    uVar86 = 0;
                    if (uVar100 == 0) {
                      uVar86 = (uint)(byte)dec_trailing_zero_table[uVar96];
                    }
                    uVar100 = 4 - (uVar86 + (byte)dec_trailing_zero_table[uVar100]);
                  }
                  else {
                    uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                    uVar86 = uVar100 * -100 + iVar67;
                    *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                    *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + uVar86 * 2);
                    uVar100 = (byte)dec_trailing_zero_table[uVar100] + 2;
                    if (uVar86 != 0) {
                      uVar100 = (uint)(byte)dec_trailing_zero_table[uVar86];
                    }
                    uVar100 = 8 - uVar100;
                  }
                }
                else {
                  uVar96 = (uint)(iVar67 * 0x147b) >> 0x13;
                  uVar100 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar92 = uVar100 >> 8;
                  uVar86 = uVar92 * 0x147b >> 0x13;
                  uVar84 = (ulong)uVar86;
                  uVar86 = uVar86 * -100 + (uVar100 >> 8);
                  *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                       *(undefined2 *)(digit_table + (ulong)uVar96 * 2);
                  *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                       *(undefined2 *)(digit_table + (uVar96 * 0x7fffff9c + iVar67) * 2);
                  *(undefined2 *)((long)puVar89 + (8 - uVar63)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  *(undefined2 *)((long)puVar89 + (10 - uVar63)) =
                       *(undefined2 *)(digit_table + uVar86 * 2);
                  iVar72 = uVar92 * -10000 + iVar72;
                  if (iVar72 == 0) {
                    iVar72 = 0xc;
                  }
                  else {
                    uVar100 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar84 = (ulong)uVar100;
                    uVar86 = uVar100 * -100 + iVar72;
                    *(undefined2 *)((long)puVar89 + (0xc - uVar63)) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    *(undefined2 *)((long)puVar89 + (0xe - uVar63)) =
                         *(undefined2 *)(digit_table + uVar86 * 2);
                    iVar72 = 0x10;
                  }
                  uVar100 = (byte)dec_trailing_zero_table[uVar84] + 2;
                  if (uVar86 != 0) {
                    uVar100 = (uint)(byte)dec_trailing_zero_table[uVar86];
                  }
                  uVar100 = iVar72 - uVar100;
                }
                local_78 = (uint *)((long)puVar89 + (uVar100 - uVar63));
                *(undefined2 *)puVar103 = 0x2e30;
                if ((int)uVar66 < 0) {
                  sVar74 = 1;
                  if (1 < (int)-uVar66) {
                    sVar74 = (size_t)-uVar66;
                  }
                  switchD_0105b559::default((undefined2 *)((long)puVar103 + 2),0x30,sVar74);
                }
              }
              else {
                uVar63 = uVar84 / 100000000;
                uVar86 = (uint)uVar63;
                puVar89 = (undefined2 *)((long)puVar103 + (2 - (ulong)(uVar86 < 100000000)));
                iVar91 = (int)((uVar63 & 0xffffffff) / 10000);
                iVar67 = iVar91 * -10000 + uVar86;
                uVar84 = uVar63 * 0xfa0a1f00 + uVar84;
                iVar72 = (int)(((uVar63 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar92 = (uint)(iVar72 * 0x29) >> 0xc;
                uVar96 = uVar92 * -100 + iVar72;
                uVar100 = iVar72 * -100 + iVar91;
                *puVar103 = 0x3030303030303030;
                puVar103[1] = 0x3030303030303030;
                puVar103[2] = 0x3030303030303030;
                *(char *)((long)puVar103 + 1) = (char)uVar92 + '0';
                uVar63 = (ulong)(uVar96 < 10 && uVar86 < 100000000);
                *puVar89 = *(undefined2 *)(digit_table + uVar63 + uVar96 * 2);
                *(undefined2 *)((long)puVar89 + (2 - uVar63)) =
                     *(undefined2 *)(digit_table + uVar100 * 2);
                iVar72 = (int)uVar84;
                if (iVar72 == 0) {
                  if (iVar67 == 0) {
                    uVar86 = 0;
                    if (uVar100 == 0) {
                      uVar86 = (uint)(byte)dec_trailing_zero_table[uVar96];
                    }
                    uVar100 = 4 - (uVar86 + (byte)dec_trailing_zero_table[uVar100]);
                  }
                  else {
                    uVar100 = (uint)(iVar67 * 0x147b) >> 0x13;
                    uVar86 = uVar100 * -100 + iVar67;
                    *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar100 * 2);
                    *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + uVar86 * 2);
                    uVar100 = (byte)dec_trailing_zero_table[uVar100] + 2;
                    if (uVar86 != 0) {
                      uVar100 = (uint)(byte)dec_trailing_zero_table[uVar86];
                    }
                    uVar100 = 8 - uVar100;
                  }
                }
                else {
                  uVar92 = (uint)(iVar67 * 0x147b) >> 0x13;
                  uVar100 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar96 = uVar100 >> 8;
                  uVar86 = uVar96 * 0x147b >> 0x13;
                  uVar84 = (ulong)uVar86;
                  uVar86 = uVar86 * -100 + (uVar100 >> 8);
                  *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                       *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                  *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                       *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar67) * 2);
                  *(undefined2 *)((long)puVar89 + (8 - uVar63)) =
                       *(undefined2 *)(digit_table + uVar84 * 2);
                  *(undefined2 *)((long)puVar89 + (10 - uVar63)) =
                       *(undefined2 *)(digit_table + uVar86 * 2);
                  iVar72 = uVar96 * -10000 + iVar72;
                  if (iVar72 == 0) {
                    iVar72 = 0xc;
                  }
                  else {
                    uVar100 = (uint)(iVar72 * 0x147b) >> 0x13;
                    uVar84 = (ulong)uVar100;
                    uVar86 = uVar100 * -100 + iVar72;
                    *(undefined2 *)((long)puVar89 + (0xc - uVar63)) =
                         *(undefined2 *)(digit_table + uVar84 * 2);
                    *(undefined2 *)((long)puVar89 + (0xe - uVar63)) =
                         *(undefined2 *)(digit_table + uVar86 * 2);
                    iVar72 = 0x10;
                  }
                  uVar100 = (byte)dec_trailing_zero_table[uVar84] + 2;
                  if (uVar86 != 0) {
                    uVar100 = (uint)(byte)dec_trailing_zero_table[uVar86];
                  }
                  uVar100 = iVar72 - uVar100;
                }
                puVar106 = (uint *)((long)puVar89 + (uVar100 - uVar63));
                uVar84 = 1;
                if (1 < (int)uVar66) {
                  uVar84 = (ulong)uVar66;
                }
                uVar63 = 0;
                do {
                  *(byte *)((long)puVar77 + uVar63 + lVar107) =
                       *(byte *)((long)puVar77 + uVar63 + lVar107 + 1);
                  uVar63 = uVar63 + 1;
                } while (uVar84 != uVar63);
                local_78 = (uint *)((undefined1 *)((long)puVar103 + (ulong)uVar66) + 2);
                *(undefined1 *)((long)puVar103 + (ulong)uVar66) = 0x2e;
                if (local_78 < puVar106) {
                  local_78 = puVar106;
                }
              }
            }
            else {
              uVar63 = uVar84 / 100000000;
              uVar66 = (uint)uVar63;
              lVar107 = 2 - (ulong)(uVar66 < 100000000);
              iVar85 = (int)((uVar63 & 0xffffffff) / 10000);
              iVar87 = iVar85 * -10000 + uVar66;
              uVar84 = uVar63 * 0xfa0a1f00 + uVar84;
              iVar91 = (int)(((uVar63 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
              uVar100 = (uint)(iVar91 * 0x29) >> 0xc;
              uVar92 = uVar100 * -100 + iVar91;
              uVar86 = iVar91 * -100 + iVar85;
              *(char *)((long)puVar103 + 1) = (char)uVar100 + '0';
              uVar63 = (ulong)(uVar92 < 10 && uVar66 < 100000000);
              *(undefined2 *)((long)puVar103 + lVar107) =
                   *(undefined2 *)(digit_table + uVar63 + uVar92 * 2);
              lVar107 = lVar107 - uVar63;
              *(undefined2 *)((long)puVar103 + lVar107 + 2) =
                   *(undefined2 *)(digit_table + uVar86 * 2);
              iVar91 = (int)uVar84;
              if (iVar91 == 0) {
                if (iVar87 == 0) {
                  uVar66 = 0;
                  if (uVar86 == 0) {
                    uVar66 = (uint)(byte)dec_trailing_zero_table[uVar92];
                  }
                  uVar66 = uVar66 + (byte)dec_trailing_zero_table[uVar86];
                  iVar91 = 4;
                }
                else {
                  uVar66 = (uint)(iVar87 * 0x147b) >> 0x13;
                  uVar100 = uVar66 * -100 + iVar87;
                  *(undefined2 *)((long)puVar103 + lVar107 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                  *(undefined2 *)((long)puVar103 + lVar107 + 6) =
                       *(undefined2 *)(digit_table + uVar100 * 2);
                  uVar66 = (byte)dec_trailing_zero_table[uVar66] + 2;
                  if (uVar100 != 0) {
                    uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                  }
                  iVar91 = 8;
                }
LAB_01d511e8:
                uVar66 = iVar91 - uVar66;
              }
              else {
                uVar92 = (uint)(iVar87 * 0x147b) >> 0x13;
                uVar66 = (uint)((uVar84 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar96 = uVar66 >> 8;
                uVar86 = uVar96 * 0x147b >> 0x13;
                uVar100 = uVar86 * -100 + (uVar66 >> 8);
                *(undefined2 *)((long)puVar103 + lVar107 + 4) =
                     *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                *(undefined2 *)((long)puVar103 + lVar107 + 6) =
                     *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar87) * 2);
                *(undefined2 *)((long)puVar103 + lVar107 + 8) =
                     *(undefined2 *)(digit_table + (ulong)uVar86 * 2);
                *(undefined2 *)((long)puVar103 + lVar107 + 10) =
                     *(undefined2 *)(digit_table + uVar100 * 2);
                iVar91 = uVar96 * -10000 + iVar91;
                if (iVar91 != 0) {
                  uVar66 = (uint)(iVar91 * 0x147b) >> 0x13;
                  uVar100 = uVar66 * -100 + iVar91;
                  *(undefined2 *)((long)puVar103 + lVar107 + 0xc) =
                       *(undefined2 *)(digit_table + (ulong)uVar66 * 2);
                  *(undefined2 *)((long)puVar103 + lVar107 + 0xe) =
                       *(undefined2 *)(digit_table + uVar100 * 2);
                  uVar66 = (byte)dec_trailing_zero_table[uVar66] + 2;
                  if (uVar100 != 0) {
                    uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                  }
                  iVar91 = 0x10;
                  goto LAB_01d511e8;
                }
                uVar66 = (byte)dec_trailing_zero_table[uVar86] + 2;
                if (uVar100 != 0) {
                  uVar66 = (uint)(byte)dec_trailing_zero_table[uVar100];
                }
                uVar66 = 0xc - uVar66;
              }
              puVar89 = (undefined2 *)
                        ((long)puVar103 +
                        (((ulong)uVar66 + lVar107) - (ulong)((ulong)uVar66 + lVar107 == 2)));
              uVar100 = (iVar67 + iVar72) - 1;
              *(undefined1 *)puVar103 = *(undefined1 *)((long)puVar103 + 1);
              *(undefined1 *)((long)puVar103 + 1) = 0x2e;
              *puVar89 = 0x2d65;
              uVar86 = uVar100 >> 0x1f;
              pcVar65 = (char *)((long)puVar89 + (ulong)uVar86 + 1);
              uVar66 = -uVar100;
              if (0 < (int)uVar100) {
                uVar66 = uVar100;
              }
              if (uVar66 < 100) {
                *(undefined2 *)pcVar65 =
                     *(undefined2 *)(digit_table + (ulong)(uVar66 < 10) + (ulong)uVar66 * 2);
                pbVar82 = (byte *)(pcVar65 + -(ulong)(uVar66 < 10));
                goto LAB_01d51759;
              }
              *pcVar65 = (char)(uVar66 * 0x290 >> 0x10) + '0';
              *(undefined2 *)((long)puVar89 + (ulong)uVar86 + 2) =
                   *(undefined2 *)
                    (digit_table + ((uVar66 * 0x290 >> 0x10) * 0x7fffff9c + uVar66) * 2);
              local_78 = (uint *)((long)puVar89 + (ulong)uVar86 + 4);
            }
          }
        }
      }
      if (local_78 != (uint *)0x0) goto LAB_01d4fc3c;
      (*p_Var6)(pvVar7,puVar77);
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar70 = &local_50;
      if (err != (yyjson_write_err *)0x0) {
        pyVar70 = err;
      }
      pyVar58->code = 4;
      pcVar65 = "nan or inf number is not allowed";
      goto LAB_01d4fca3;
    case 5:
switchD_01d4abf4_caseD_5:
      uVar63 = uVar84 >> 8;
      puVar106 = (uint *)(val->uni).str;
      puVar77 = (uint *)(*p_Var5)(pvVar7,uVar63 * 6 + 4);
      if (puVar77 != (uint *)0x0) {
        if ((puVar99 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar88 = (uint *)(uVar63 + (long)puVar106);
          *(byte *)puVar77 = 0x22;
          puVar102 = puVar77;
LAB_01d4fefa:
          lVar107 = (long)puVar88 - (long)puVar106;
          if (0xf < lVar107) {
            lVar97 = 0;
            do {
              puVar64 = (uint *)((long)puVar102 + lVar97 + 1);
              puVar78 = (uint *)((long)puVar106 + lVar97);
              if (puVar99[*(byte *)((long)puVar106 + lVar97)] != '\0') goto LAB_01d502d6;
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 1)] != '\0') {
                puVar64 = (uint *)((long)puVar102 + lVar97 + 1);
                puVar78 = (uint *)((long)puVar106 + lVar97);
                goto LAB_01d500ee;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 2)] != '\0') {
                puVar64 = (uint *)((long)puVar102 + lVar97 + 1);
                puVar78 = (uint *)((long)puVar106 + lVar97);
                goto LAB_01d5010b;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 3)] != '\0') {
                puVar64 = (uint *)((long)puVar102 + lVar97 + 1);
                puVar78 = (uint *)((long)puVar106 + lVar97);
                goto LAB_01d5012c;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 4)] != '\0') {
                puVar78 = (uint *)((byte *)((long)puVar106 + lVar97) + 4);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 5);
                *(undefined4 *)((long)puVar102 + lVar97 + 1) =
                     *(undefined4 *)((long)puVar106 + lVar97);
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 5)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 5);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 6);
                *(byte *)((long)puVar64 + -1) = pbVar82[4];
                *(undefined4 *)((long)puVar64 + -5) = *(undefined4 *)pbVar82;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 6)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 6);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 7);
                *(ushort *)((long)puVar64 + -2) = *(ushort *)(pbVar82 + 4);
                *(undefined4 *)((long)puVar64 + -6) = *(undefined4 *)pbVar82;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 7)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 7);
                uVar4 = *(undefined4 *)pbVar82;
                puVar64 = (uint *)((long)puVar102 + lVar97 + 8);
                *(undefined4 *)((long)puVar102 + lVar97 + 4) = *(undefined4 *)(pbVar82 + 3);
                *(undefined4 *)((long)puVar102 + lVar97 + 1) = uVar4;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 8)] != '\0') {
                puVar78 = (uint *)((byte *)((long)puVar106 + lVar97) + 8);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 9);
                *(undefined8 *)((long)puVar102 + lVar97 + 1) =
                     *(undefined8 *)((long)puVar106 + lVar97);
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 9)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 9);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 10);
                *(byte *)((long)puVar64 + -1) = pbVar82[8];
                *(undefined8 *)((long)puVar64 + -9) = *(undefined8 *)pbVar82;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 10)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 10);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 0xb);
                *(ushort *)((long)puVar64 + -2) = *(ushort *)(pbVar82 + 8);
                *(undefined8 *)((long)puVar64 + -10) = *(undefined8 *)pbVar82;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 0xb)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 0xb);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 0xc);
                puVar64[-1] = *(uint *)(pbVar82 + 7);
                *(undefined8 *)((long)puVar64 + -0xb) = *(undefined8 *)pbVar82;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 0xc)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 0xc);
                puVar64 = (uint *)((long)puVar102 + lVar97 + 0xd);
                puVar64[-1] = *(uint *)(pbVar82 + 8);
                *(undefined8 *)(puVar64 + -3) = *(undefined8 *)pbVar82;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 0xd)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 0xd);
                uVar73 = *(undefined8 *)pbVar82;
                puVar64 = (uint *)((long)puVar102 + lVar97 + 0xe);
                *(undefined8 *)((long)puVar102 + lVar97 + 6) = *(undefined8 *)(pbVar82 + 5);
                *(undefined8 *)((long)puVar102 + lVar97 + 1) = uVar73;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 0xe)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 0xe);
                uVar73 = *(undefined8 *)pbVar82;
                puVar64 = (uint *)((long)puVar102 + lVar97 + 0xf);
                *(undefined8 *)((long)puVar102 + lVar97 + 7) = *(undefined8 *)(pbVar82 + 6);
                *(undefined8 *)((long)puVar102 + lVar97 + 1) = uVar73;
                goto LAB_01d502d6;
              }
              if (puVar99[*(byte *)((long)puVar106 + lVar97 + 0xf)] != '\0') {
                pbVar82 = (byte *)((long)puVar106 + lVar97);
                puVar78 = (uint *)(pbVar82 + 0xf);
                uVar73 = *(undefined8 *)pbVar82;
                puVar64 = (uint *)((long)puVar102 + lVar97 + 0x10);
                *(undefined8 *)((long)puVar102 + lVar97 + 8) = *(undefined8 *)(pbVar82 + 7);
                *(undefined8 *)((long)puVar102 + lVar97 + 1) = uVar73;
                goto LAB_01d502d6;
              }
              uVar66 = puVar78[1];
              uVar100 = puVar78[2];
              uVar86 = puVar78[3];
              *puVar64 = *puVar78;
              *(uint *)((long)puVar102 + lVar97 + 5) = uVar66;
              *(uint *)((long)puVar102 + lVar97 + 9) = uVar100;
              *(uint *)((long)puVar102 + lVar97 + 0xd) = uVar86;
              lVar97 = lVar97 + 0x10;
              lVar107 = lVar107 + -0x10;
            } while (0xf < lVar107);
            puVar102 = (uint *)((long)puVar102 + lVar97);
            puVar106 = (uint *)((long)puVar106 + lVar97);
          }
          puVar64 = (uint *)((long)puVar102 + 1);
          puVar78 = puVar106;
          for (lVar107 = (long)puVar88 - (long)puVar106; 3 < lVar107; lVar107 = lVar107 + -4) {
            if (puVar99[(byte)*puVar78] != '\0') goto LAB_01d502d6;
            if (puVar99[*(byte *)((long)puVar78 + 1)] != '\0') goto LAB_01d500ee;
            if (puVar99[*(byte *)((long)puVar78 + 2)] != '\0') goto LAB_01d5010b;
            if (puVar99[*(byte *)((long)puVar78 + 3)] != '\0') goto LAB_01d5012c;
            *puVar64 = *puVar78;
            puVar64 = puVar64 + 1;
            puVar78 = puVar78 + 1;
          }
          while( true ) {
            if (puVar88 <= puVar78) goto switchD_01d50300_default;
            uVar66 = *puVar78;
            if (puVar99[(byte)uVar66] != '\0') break;
            puVar78 = (uint *)((long)puVar78 + 1);
            *(byte *)puVar64 = (byte)uVar66;
            puVar64 = (uint *)((long)puVar64 + 1);
          }
          goto LAB_01d502d6;
        }
        puVar102 = (uint *)((long)puVar77 + 1);
        *(byte *)puVar77 = 0x22;
        if (0xfff < uVar84) {
          do {
            uVar73 = *(undefined8 *)(puVar106 + 2);
            *(undefined8 *)puVar102 = *(undefined8 *)puVar106;
            *(undefined8 *)(puVar102 + 2) = uVar73;
            puVar102 = puVar102 + 4;
            puVar106 = puVar106 + 4;
            uVar63 = uVar63 - 0x10;
          } while (0xf < uVar63);
        }
        for (; 3 < uVar63; uVar63 = uVar63 - 4) {
          *puVar102 = *puVar106;
          puVar102 = puVar102 + 1;
          puVar106 = puVar106 + 1;
        }
        if (uVar63 != 0) {
          uVar84 = 0;
          do {
            *(byte *)((long)puVar102 + uVar84) = *(byte *)((long)puVar106 + uVar84);
            uVar84 = uVar84 + 1;
          } while (uVar63 != uVar84);
          puVar102 = (uint *)((long)puVar102 + uVar84);
        }
        *(byte *)puVar102 = 0x22;
        local_78 = (uint *)((long)puVar102 + 1);
        goto LAB_01d4fc3c;
      }
      break;
    case 6:
switchD_01d4abf4_caseD_6:
      puVar77 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar77 != (uint *)0x0) {
        *(ushort *)puVar77 = 0x5d5b;
LAB_01d4fc30:
        local_78 = (uint *)((long)puVar77 + 2);
        goto LAB_01d4fc3c;
      }
      break;
    case 7:
switchD_01d4abf4_caseD_7:
      puVar77 = (uint *)(*p_Var5)(pvVar7,4);
      if (puVar77 != (uint *)0x0) {
        *(ushort *)puVar77 = 0x7d7b;
        goto LAB_01d4fc30;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar70 = &local_50;
    if (err != (yyjson_write_err *)0x0) {
      pyVar70 = err;
    }
    pyVar58->code = 2;
    pcVar65 = "memory allocation failed";
    goto LAB_01d4fca3;
  }
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_50;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar70->msg = "input JSON is NULL";
  pyVar58->code = 1;
  goto LAB_01d4fca7;
LAB_01d4db6b:
  *(byte *)puVar64 = (byte)*puVar78;
  puVar64 = (uint *)((long)puVar64 + 1);
  puVar78 = (uint *)((long)puVar78 + 1);
  goto LAB_01d4dd42;
LAB_01d4db87:
  *(ushort *)puVar64 = (ushort)*puVar78;
  puVar64 = (uint *)((long)puVar64 + 2);
  puVar78 = (uint *)((long)puVar78 + 2);
  goto LAB_01d4dd42;
LAB_01d4dba7:
  *(byte *)((long)puVar64 + 2) = *(byte *)((long)puVar78 + 2);
  *(ushort *)puVar64 = (ushort)*puVar78;
  puVar64 = (uint *)((long)puVar64 + 3);
  puVar78 = (uint *)((long)puVar78 + 3);
LAB_01d4dd42:
  puVar106 = puVar78 + 1;
  if (puVar106 <= puVar77) {
LAB_01d4dd4f:
    bVar105 = (byte)*puVar78;
    switch(puVar99[bVar105]) {
    case 0:
      goto switchD_01d4dd6b_caseD_0;
    case 1:
      goto switchD_01d4dd6b_caseD_1;
    case 2:
      *(ushort *)puVar64 = *(ushort *)(esc_single_char_table + (ulong)bVar105 * 2);
      puVar64 = (uint *)((long)puVar64 + 2);
      puVar78 = (uint *)((long)puVar78 + 1);
      goto LAB_01d4dd42;
    case 3:
      *puVar64 = 0x3030755c;
      *(ushort *)(puVar64 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar78 * 2);
      goto LAB_01d4dfb3;
    case 4:
      uVar3 = (ushort)*puVar78;
      if ((uVar3 & 0x1e) != 0 && (uVar3 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar64 = uVar3;
        puVar64 = (uint *)((long)puVar64 + 2);
        puVar78 = (uint *)((long)puVar78 + 2);
        goto LAB_01d4dd42;
      }
      break;
    case 5:
      yyjson_val_write_opts();
      uVar63 = extraout_RAX_01;
      goto LAB_01d4dffd;
    case 6:
      if (puVar77 < puVar106) {
        uVar66 = (uint)(ushort)*puVar78;
        uVar100 = (uint)(uint3)*puVar78;
        if (((uint3)*puVar78 & 0xc0c0f0) != 0x8080e0) goto LAB_01d4e070;
LAB_01d4df5a:
        bVar109 = false;
        if (((uVar66 & 0x200f) != 0) && ((uVar66 & 0x200f) != 0x200d)) {
          *puVar64 = uVar100;
          puVar64 = (uint *)((long)puVar64 + 3);
          puVar78 = (uint *)((long)puVar78 + 3);
          bVar109 = true;
        }
      }
      else {
        uVar66 = *puVar78;
        uVar100 = uVar66;
        if ((uVar66 & 0xc0c0f0) == 0x8080e0) goto LAB_01d4df5a;
LAB_01d4e070:
        bVar109 = false;
      }
      if (bVar109) goto LAB_01d4dd42;
      break;
    case 7:
      yyjson_val_write_opts();
      uVar63 = extraout_RAX_02;
LAB_01d4dffd:
      puVar78 = local_60;
      puVar64 = local_78;
      if ((uVar63 & 1) == 0) goto LAB_01d4de7e;
      goto LAB_01d4dd42;
    case 8:
      uVar66 = *puVar78;
      bVar109 = false;
      if (((uVar66 & 0xc0c0c0f8) == 0x808080f0) && ((uVar66 & 0x3007) != 0)) {
        if (((byte)uVar66 >> 2 & (uVar66 & 0x3003) != 0) == 0) {
          *puVar64 = uVar66;
          puVar64 = puVar64 + 1;
          bVar109 = true;
          puVar78 = puVar106;
        }
        else {
          bVar109 = false;
        }
      }
      if (bVar109) goto LAB_01d4dd42;
      break;
    case 9:
      goto switchD_01d4dd6b_caseD_9;
    default:
      goto switchD_01d4dd6b_default;
    }
LAB_01d4df7f:
    if ((flg & 0x20) == 0) goto LAB_01d4ea88;
    *(byte *)puVar64 = (byte)*puVar78;
    puVar78 = (uint *)((long)puVar78 + 1);
    puVar64 = (uint *)((long)puVar64 + 1);
    goto LAB_01d4dd42;
  }
  if (puVar77 != puVar78) {
    if ((long)(ulong)((byte)puVar99[(byte)*puVar78] >> 1) <= (long)puVar77 - (long)puVar78)
    goto LAB_01d4dd4f;
switchD_01d4dd6b_caseD_1:
    if ((flg & 2) == 0) goto LAB_01d4df7f;
    goto LAB_01d4de7e;
  }
switchD_01d4dd6b_default:
  *(byte *)puVar64 = 0x22;
  pbVar82 = (byte *)((long)puVar64 + 1);
LAB_01d4ef4f:
  if (pbVar82 == (byte *)0x0) goto LAB_01d4f967;
LAB_01d4ef5d:
  bVar105 = 0x3a;
  if ((~(uint)lVar107 & (uint)uVar84) == 0) {
    bVar105 = 0x2c;
  }
  *pbVar82 = bVar105;
  puVar106 = (uint *)(pbVar82 + 1);
  sVar104 = uVar61;
  puVar77 = puVar88;
LAB_01d4f367:
  pyVar93 = pyVar93 + 1;
  lVar107 = lVar107 + -1;
  if (lVar107 == 0) goto LAB_01d4f814;
  goto LAB_01d4d551;
switchD_01d4dd6b_caseD_9:
  uVar66 = *puVar78;
  bVar109 = false;
  if (((uVar66 & 0xc0c0c0f8) == 0x808080f0) && ((uVar66 & 0x3007) != 0)) {
    if (((byte)uVar66 >> 2 & (uVar66 & 0x3003) != 0) == 0) {
      bVar105 = *(byte *)((long)puVar78 + 2);
      uVar66 = (bVar105 & 0x3f) * 0x40;
      bVar2 = *(byte *)((long)puVar78 + 3);
      uVar100 = (uVar66 + ((*(byte *)((long)puVar78 + 1) & 0x3f) << 0xc |
                          ((byte)*puVar78 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar64 = 0x755c;
      *(ushort *)((long)puVar64 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar100 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar64 + 1) = *(ushort *)(esc_hex_char_table + (uVar100 >> 9 & 0x1fe));
      *(ushort *)((long)puVar64 + 6) = 0x755c;
      *(ushort *)(puVar64 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar105 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar64 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar66 & 0xff | bVar2 & 0x3f) * 2);
      puVar64 = puVar64 + 3;
      bVar109 = true;
      puVar78 = puVar106;
    }
    else {
      bVar109 = false;
    }
  }
  if (!bVar109) {
LAB_01d4de7e:
    if ((flg & 0x20) == 0) {
LAB_01d4ea88:
      pbVar82 = (byte *)0x0;
      goto LAB_01d4ef4f;
    }
    *(ushort *)puVar64 = 0x755c;
    ((ushort *)((long)puVar64 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar64 + 2))[1] = 0x4446;
LAB_01d4dfb3:
    puVar78 = (uint *)((long)puVar78 + 1);
    puVar64 = (uint *)((long)puVar64 + 6);
  }
  goto LAB_01d4dd42;
switchD_01d4dd6b_caseD_0:
  puVar102 = (uint *)((long)puVar78 + 1);
  *(byte *)puVar64 = bVar105;
  puVar106 = puVar64;
  goto LAB_01d4d98a;
LAB_01d4f814:
  lVar90 = 0;
  lVar97 = 0;
  do {
    *(byte *)((long)puVar106 + lVar97 + -1) = (char)local_d8 * ' ' + 0x5d;
    *(byte *)((long)puVar106 + lVar97) = 0x2c;
    if (local_b8 <= (uint *)((long)puVar77 + lVar90)) {
      if (local_ec < '\0') {
        if ((uint *)((long)puVar77 + lVar90) <= (uint *)((long)puVar106 + lVar97 + 3)) {
          uVar84 = 2;
          if (2 < sVar104 >> 1) {
            uVar84 = sVar104 >> 1;
          }
          uVar84 = uVar84 + 7 & 0xfffffffffffffff8;
          pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,sVar104,sVar104 + uVar84);
          if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
          memmove(pbVar82 + (long)((long)puVar77 +
                                  lVar97 * 8 + ((uVar84 + sVar104) - (long)local_b8)),
                  pbVar82 + (long)((long)puVar77 + (lVar97 * 8 - (long)local_e8)),
                  (size_t)((long)local_b8 + (-lVar90 - (long)puVar77)));
          puVar106 = (uint *)(pbVar82 + ((long)puVar106 - (long)local_e8));
          local_e8 = pbVar82;
        }
        pbVar82 = (byte *)((long)puVar106 + lVar97) + 1;
        *(byte *)((long)puVar106 + lVar97) = 10;
      }
      else {
        pbVar82 = (byte *)((long)puVar106 + lVar97);
      }
      *pbVar82 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar82 - (long)local_e8;
      }
      goto LAB_01d518a5;
    }
    lVar107 = lVar97 * 2;
    local_d8 = *(ulong *)(puVar77 + lVar107) & 0xffffffffffffff01;
    lVar97 = lVar97 + 1;
    lVar90 = lVar90 + 8;
    lVar107 = (*(ulong *)(puVar77 + lVar107) >> 1) - 1;
  } while (lVar107 == 0);
  puVar77 = (uint *)((long)puVar77 + lVar90);
  puVar106 = (uint *)((long)puVar106 + lVar97);
  goto LAB_01d4d540;
LAB_01d4b3ee:
  *(byte *)puVar78 = (byte)*puVar88;
  puVar78 = (uint *)((long)puVar78 + 1);
  puVar88 = (uint *)((long)puVar88 + 1);
  goto LAB_01d4b610;
LAB_01d4b410:
  *(ushort *)puVar78 = (ushort)*puVar88;
  puVar78 = (uint *)((long)puVar78 + 2);
  puVar88 = (uint *)((long)puVar88 + 2);
  goto LAB_01d4b610;
LAB_01d4b436:
  *(byte *)((long)puVar78 + 2) = *(byte *)((long)puVar88 + 2);
  *(ushort *)puVar78 = (ushort)*puVar88;
  puVar78 = (uint *)((long)puVar78 + 3);
  puVar88 = (uint *)((long)puVar88 + 3);
LAB_01d4b610:
  puVar77 = puVar88 + 1;
  if (puVar77 <= puVar102) {
LAB_01d4b61d:
    bVar105 = (byte)*puVar88;
    switch(puVar75[bVar105]) {
    case 0:
      goto switchD_01d4b639_caseD_0;
    case 1:
      goto switchD_01d4b639_caseD_1;
    case 2:
      *(ushort *)puVar78 = *(ushort *)(esc_single_char_table + (ulong)bVar105 * 2);
      puVar78 = (uint *)((long)puVar78 + 2);
      puVar88 = (uint *)((long)puVar88 + 1);
      goto LAB_01d4b610;
    case 3:
      *puVar78 = 0x3030755c;
      *(ushort *)(puVar78 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar88 * 2);
      goto LAB_01d4b876;
    case 4:
      uVar3 = (ushort)*puVar88;
      if ((uVar3 & 0x1e) != 0 && (uVar3 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar78 = uVar3;
        puVar78 = (uint *)((long)puVar78 + 2);
        puVar88 = (uint *)((long)puVar88 + 2);
        goto LAB_01d4b610;
      }
      break;
    case 5:
      yyjson_val_write_opts();
      uVar61 = extraout_RAX;
      goto LAB_01d4b8b4;
    case 6:
      if (puVar102 < puVar77) {
        uVar86 = (uint)(uint3)*puVar88;
        uVar92 = (uint)(ushort)*puVar88;
        if ((uVar86 & 0xc0c0f0) != 0x8080e0) goto LAB_01d4b927;
LAB_01d4b821:
        bVar109 = false;
        if (((uVar92 & 0x200f) != 0) && ((uVar92 & 0x200f) != 0x200d)) {
          *puVar78 = uVar86;
          puVar78 = (uint *)((long)puVar78 + 3);
          puVar88 = (uint *)((long)puVar88 + 3);
          bVar109 = true;
        }
      }
      else {
        uVar86 = *puVar88;
        uVar92 = uVar86;
        if ((uVar86 & 0xc0c0f0) == 0x8080e0) goto LAB_01d4b821;
LAB_01d4b927:
        bVar109 = false;
      }
      if (bVar109) goto LAB_01d4b610;
      break;
    case 7:
      yyjson_val_write_opts();
      uVar61 = extraout_RAX_00;
LAB_01d4b8b4:
      puVar78 = local_78;
      puVar88 = local_60;
      if ((uVar61 & 1) == 0) goto LAB_01d4b745;
      goto LAB_01d4b610;
    case 8:
      uVar86 = *puVar88;
      bVar109 = false;
      if (((uVar86 & 0xc0c0c0f8) == 0x808080f0) && ((uVar86 & 0x3007) != 0)) {
        if (((byte)uVar86 >> 2 & (uVar86 & 0x3003) != 0) == 0) {
          *puVar78 = uVar86;
          puVar78 = puVar78 + 1;
          bVar109 = true;
          puVar88 = puVar77;
        }
        else {
          bVar109 = false;
        }
      }
      if (bVar109) goto LAB_01d4b610;
      break;
    case 9:
      goto switchD_01d4b639_caseD_9;
    default:
      goto switchD_01d4b639_default;
    }
LAB_01d4b845:
    if ((flg & 0x20) == 0) goto LAB_01d4c3c7;
    *(byte *)puVar78 = (byte)*puVar88;
    puVar78 = (uint *)((long)puVar78 + 1);
    puVar88 = (uint *)((long)puVar88 + 1);
    goto LAB_01d4b610;
  }
  if (puVar102 != puVar88) {
    if ((long)(ulong)((byte)puVar75[(byte)*puVar88] >> 1) <= (long)puVar102 - (long)puVar88)
    goto LAB_01d4b61d;
switchD_01d4b639_caseD_1:
    if ((flg & 2) == 0) goto LAB_01d4b845;
    goto LAB_01d4b745;
  }
switchD_01d4b639_default:
  *(byte *)puVar78 = 0x22;
  pbVar82 = (byte *)((long)puVar78 + 1);
LAB_01d4c8a7:
  if (pbVar82 == (byte *)0x0) goto LAB_01d4f967;
LAB_01d4c8b5:
  bVar109 = (~uVar100 & uVar66) == 0;
  bVar105 = 0x3a;
  if (bVar109) {
    bVar105 = 0x2c;
  }
  *pbVar82 = bVar105;
  bVar105 = 0x20;
  if (bVar109) {
    bVar105 = 10;
  }
  pbVar82[1] = bVar105;
  puVar77 = (uint *)(pbVar82 + 2);
LAB_01d4c9d0:
  pyVar93 = pyVar93 + 1;
  lVar90 = lVar90 + -1;
  puVar79 = puVar59;
  lVar69 = lVar97;
  if (lVar90 == 0) goto LAB_01d4d425;
  goto LAB_01d4ad1f;
switchD_01d4b639_caseD_9:
  uVar86 = *puVar88;
  bVar109 = false;
  if (((uVar86 & 0xc0c0c0f8) == 0x808080f0) && ((uVar86 & 0x3007) != 0)) {
    if (((byte)uVar86 >> 2 & (uVar86 & 0x3003) != 0) == 0) {
      bVar105 = *(byte *)((long)puVar88 + 2);
      uVar86 = (bVar105 & 0x3f) * 0x40;
      bVar2 = *(byte *)((long)puVar88 + 3);
      uVar92 = (uVar86 + ((*(byte *)((long)puVar88 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar88 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar78 = 0x755c;
      *(ushort *)((long)puVar78 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar92 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar78 + 1) = *(ushort *)(esc_hex_char_table + (uVar92 >> 9 & 0x1fe));
      *(ushort *)((long)puVar78 + 6) = 0x755c;
      *(ushort *)(puVar78 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar105 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar78 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar86 & 0xff | bVar2 & 0x3f) * 2);
      puVar78 = puVar78 + 3;
      bVar109 = true;
      puVar88 = puVar77;
    }
    else {
      bVar109 = false;
    }
  }
  if (!bVar109) {
LAB_01d4b745:
    if ((flg & 0x20) == 0) {
LAB_01d4c3c7:
      pbVar82 = (byte *)0x0;
      goto LAB_01d4c8a7;
    }
    *(ushort *)puVar78 = 0x755c;
    ((ushort *)((long)puVar78 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar78 + 2))[1] = 0x4446;
LAB_01d4b876:
    puVar78 = (uint *)((long)puVar78 + 6);
    puVar88 = (uint *)((long)puVar88 + 1);
  }
  goto LAB_01d4b610;
switchD_01d4b639_caseD_0:
  puVar106 = (uint *)((long)puVar88 + 1);
  *(byte *)puVar78 = bVar105;
  puVar77 = puVar78;
  goto LAB_01d4b202;
LAB_01d4f967:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_50;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar58->code = 7;
  pcVar65 = "invalid utf-8 encoding in string";
  goto LAB_01d4f8a7;
LAB_01d4f86d:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar70 = &local_50;
  if (err != (yyjson_write_err *)0x0) {
    pyVar70 = err;
  }
  pyVar58->code = 3;
  pcVar65 = "invalid JSON value type";
LAB_01d4f8a7:
  pyVar70->msg = pcVar65;
  if (local_e8 != (byte *)0x0) {
    (*p_Var6)(pvVar7,local_e8);
  }
  goto LAB_01d4fca7;
  while( true ) {
    uVar84 = *puVar79;
    puVar59 = puVar79 + 1;
    local_40 = uVar84 & 0xffffffffffffff01;
    puVar77 = (uint *)(pbVar82 + 3);
    pbVar82[1] = 0x2c;
    pbVar82[2] = 10;
    lVar90 = (uVar84 >> 1) - 1;
    lVar69 = lVar97;
    if (lVar90 != 0) break;
LAB_01d4d425:
    pbVar82 = (byte *)((long)puVar77 + -1);
    *(byte *)((long)puVar77 + -2) = 10;
    puVar79 = puVar59;
    if (puVar59 <= (ulong *)(lVar69 * 4 + -1 + (long)puVar77)) {
      uVar84 = local_e0 >> 1;
      if (local_e0 >> 1 <= (ulong)(lVar69 * 4)) {
        uVar84 = lVar69 * 4;
      }
      sVar104 = (uVar84 + 7 & 0xfffffffffffffff8) + local_e0;
      pbVar76 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
      if (pbVar76 == (byte *)0x0) goto LAB_01d4f8d1;
      puVar79 = (ulong *)(pbVar76 + (sVar104 - ((long)local_90 - (long)puVar59)));
      memmove(puVar79,pbVar76 + ((long)puVar59 - (long)local_e8),(long)local_90 - (long)puVar59);
      pbVar82 = pbVar76 + ((long)pbVar82 - (long)local_e8);
      local_90 = (ulong *)(pbVar76 + sVar104);
      local_e8 = pbVar76;
      local_e0 = sVar104;
    }
    lVar97 = lVar69 + -1;
    if (lVar97 != 0) {
      lVar90 = 1;
      do {
        pbVar82[0] = 0x20;
        pbVar82[1] = 0x20;
        pbVar82[2] = 0x20;
        pbVar82[3] = 0x20;
        pbVar82 = pbVar82 + lVar107;
        lVar90 = lVar90 + 1;
      } while (lVar69 != lVar90);
    }
    *pbVar82 = (char)local_40 * ' ' + 0x5d;
    if (local_90 <= puVar79) {
      pbVar76 = pbVar82 + 1;
      if (local_ec < '\0') {
        if (puVar79 <= pbVar82 + 3) {
          uVar84 = 2;
          if (2 < local_e0 >> 1) {
            uVar84 = local_e0 >> 1;
          }
          sVar104 = (uVar84 + 7 & 0xfffffffffffffff8) + local_e0;
          pbVar82 = (byte *)(*p_Var8)(pvVar7,local_e8,local_e0,sVar104);
          if (pbVar82 == (byte *)0x0) goto LAB_01d4f8d1;
          memmove(pbVar82 + (sVar104 - ((long)local_90 - (long)puVar79)),
                  pbVar82 + ((long)puVar79 - (long)local_e8),(long)local_90 - (long)puVar79);
          pbVar76 = pbVar82 + ((long)pbVar76 - (long)local_e8);
          local_e8 = pbVar82;
        }
        *pbVar76 = 10;
        pbVar76 = pbVar76 + 1;
      }
      *pbVar76 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar76 - (long)local_e8;
      }
LAB_01d518a5:
      *(undefined8 *)pyVar58 = 0;
      pyVar58->msg = (char *)0x0;
      return (char *)local_e8;
    }
  }
  goto LAB_01d4acee;
LAB_01d500ee:
  *(byte *)puVar64 = (byte)*puVar78;
  puVar64 = (uint *)((long)puVar64 + 1);
  puVar78 = (uint *)((long)puVar78 + 1);
  goto LAB_01d502d6;
LAB_01d5010b:
  *(ushort *)puVar64 = (ushort)*puVar78;
  puVar64 = (uint *)((long)puVar64 + 2);
  puVar78 = (uint *)((long)puVar78 + 2);
  goto LAB_01d502d6;
switchD_01d50300_caseD_9:
  uVar66 = *puVar78;
  bVar109 = false;
  if (((uVar66 & 0xc0c0c0f8) == 0x808080f0) && ((uVar66 & 0x3007) != 0)) {
    if (((byte)uVar66 >> 2 & (uVar66 & 0x3003) != 0) == 0) {
      bVar105 = *(byte *)((long)puVar78 + 2);
      uVar66 = (bVar105 & 0x3f) * 0x40;
      bVar2 = *(byte *)((long)puVar78 + 3);
      uVar100 = (uVar66 + ((*(byte *)((long)puVar78 + 1) & 0x3f) << 0xc |
                          ((byte)*puVar78 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar64 = 0x755c;
      *(ushort *)((long)puVar64 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar100 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar64 + 1) = *(ushort *)(esc_hex_char_table + (uVar100 >> 9 & 0x1fe));
      *(ushort *)((long)puVar64 + 6) = 0x755c;
      *(ushort *)(puVar64 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar105 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar64 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar66 & 0xff | bVar2 & 0x3f) * 2);
      puVar64 = puVar64 + 3;
      bVar109 = true;
      puVar78 = puVar106;
    }
    else {
      bVar109 = false;
    }
  }
  if (!bVar109) {
LAB_01d503f8:
    if ((flg & 0x20) == 0) {
LAB_01d50f21:
      local_78 = (uint *)0x0;
      goto LAB_01d51382;
    }
    *(ushort *)puVar64 = 0x755c;
    ((ushort *)((long)puVar64 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar64 + 2))[1] = 0x4446;
LAB_01d5051c:
    puVar64 = (uint *)((long)puVar64 + 6);
    puVar78 = (uint *)((long)puVar78 + 1);
  }
  goto LAB_01d502d6;
switchD_01d50300_caseD_0:
  puVar106 = (uint *)((long)puVar78 + 1);
  *(byte *)puVar64 = bVar105;
  puVar102 = puVar64;
  goto LAB_01d4fefa;
LAB_01d5012c:
  *(byte *)((long)puVar64 + 2) = *(byte *)((long)puVar78 + 2);
  *(ushort *)puVar64 = (ushort)*puVar78;
  puVar64 = (uint *)((long)puVar64 + 3);
  puVar78 = (uint *)((long)puVar78 + 3);
LAB_01d502d6:
  puVar106 = puVar78 + 1;
  if (puVar106 <= puVar88) {
LAB_01d502e3:
    bVar105 = (byte)*puVar78;
    switch(puVar99[bVar105]) {
    case 0:
      goto switchD_01d50300_caseD_0;
    case 1:
      goto switchD_01d50300_caseD_1;
    case 2:
      *(ushort *)puVar64 = *(ushort *)(esc_single_char_table + (ulong)bVar105 * 2);
      puVar64 = (uint *)((long)puVar64 + 2);
      puVar78 = (uint *)((long)puVar78 + 1);
      goto LAB_01d502d6;
    case 3:
      *puVar64 = 0x3030755c;
      *(ushort *)(puVar64 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar78 * 2);
      goto LAB_01d5051c;
    case 4:
      uVar3 = (ushort)*puVar78;
      if ((uVar3 & 0x1e) != 0 && (uVar3 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar64 = uVar3;
        puVar64 = (uint *)((long)puVar64 + 2);
        puVar78 = (uint *)((long)puVar78 + 2);
        goto LAB_01d502d6;
      }
      break;
    case 5:
      yyjson_val_write_opts();
      uVar84 = extraout_RAX_03;
      goto LAB_01d5055a;
    case 6:
      if (puVar88 < puVar106) {
        uVar66 = (uint)(uint3)*puVar78;
        if ((uVar66 & 0xc0c0f0) == 0x8080e0) {
          bVar109 = false;
          if ((*puVar78 & 0x200f) != 0) {
            if ((*puVar78 & 0x200f) != 0x200d) goto LAB_01d504de;
            goto LAB_01d504ea;
          }
        }
        bVar109 = false;
      }
      else {
        uVar66 = *puVar78;
        if ((uVar66 & 0xc0c0f0) == 0x8080e0) {
          bVar109 = false;
          if (((uVar66 & 0x200f) != 0) && ((uVar66 & 0x200f) != 0x200d)) {
LAB_01d504de:
            *puVar64 = uVar66;
            puVar64 = (uint *)((long)puVar64 + 3);
            puVar78 = (uint *)((long)puVar78 + 3);
            bVar109 = true;
          }
        }
        else {
          bVar109 = false;
        }
      }
LAB_01d504ea:
      if (bVar109) goto LAB_01d502d6;
      break;
    case 7:
      yyjson_val_write_opts();
      uVar84 = extraout_RAX_04;
LAB_01d5055a:
      puVar64 = local_78;
      puVar78 = local_60;
      if ((uVar84 & 1) == 0) goto LAB_01d503f8;
      goto LAB_01d502d6;
    case 8:
      uVar66 = *puVar78;
      bVar109 = false;
      if (((uVar66 & 0xc0c0c0f8) == 0x808080f0) && ((uVar66 & 0x3007) != 0)) {
        if (((byte)uVar66 >> 2 & (uVar66 & 0x3003) != 0) == 0) {
          *puVar64 = uVar66;
          puVar64 = puVar64 + 1;
          bVar109 = true;
          puVar78 = puVar106;
        }
        else {
          bVar109 = false;
        }
      }
      if (bVar109) goto LAB_01d502d6;
      break;
    case 9:
      goto switchD_01d50300_caseD_9;
    default:
      goto switchD_01d50300_default;
    }
LAB_01d504f2:
    if ((flg & 0x20) == 0) goto LAB_01d50f21;
    *(byte *)puVar64 = (byte)*puVar78;
    puVar64 = (uint *)((long)puVar64 + 1);
    puVar78 = (uint *)((long)puVar78 + 1);
    goto LAB_01d502d6;
  }
  if (puVar88 != puVar78) {
    if ((long)(ulong)((byte)puVar99[(byte)*puVar78] >> 1) <= (long)puVar88 - (long)puVar78)
    goto LAB_01d502e3;
switchD_01d50300_caseD_1:
    if ((flg & 2) == 0) goto LAB_01d504f2;
    goto LAB_01d503f8;
  }
switchD_01d50300_default:
  *(byte *)puVar64 = 0x22;
  local_78 = (uint *)((long)puVar64 + 1);
LAB_01d51382:
  if (local_78 == (uint *)0x0) {
    (*p_Var6)(pvVar7,puVar77);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar70 = &local_50;
    if (err != (yyjson_write_err *)0x0) {
      pyVar70 = err;
    }
    pyVar58->code = 7;
    pcVar65 = "invalid utf-8 encoding in string";
LAB_01d4fca3:
    pyVar70->msg = pcVar65;
LAB_01d4fca7:
    puVar77 = (uint *)0x0;
  }
  else {
LAB_01d4fc3c:
    if (local_ec < '\0') {
      *(byte *)local_78 = 10;
      local_78 = (uint *)((long)local_78 + 1);
    }
    *(byte *)local_78 = 0;
    if (dat_len != (usize *)0x0) {
      *dat_len = (long)local_78 - (long)puVar77;
    }
    *(undefined8 *)pyVar58 = 0;
    pyVar58->msg = (char *)0x0;
  }
  return (char *)puVar77;
}

Assistant:

char *yyjson_val_write_opts(const yyjson_val *val,
                            yyjson_write_flag flg,
                            const yyjson_alc *alc_ptr,
                            usize *dat_len,
                            yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_val *root = constcast(yyjson_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_READ_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_write_pretty(root, flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_write_minify(root, flg, alc, dat_len, err);
    }
}